

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O3

int __thiscall
ncnn::BinaryOp::forward
          (BinaryOp *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  pointer pMVar7;
  Mat *this_00;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  uint uVar14;
  void *pvVar15;
  uint uVar16;
  void *pvVar17;
  void *pvVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  void *pvVar22;
  long lVar23;
  ulong uVar24;
  float *ptr1_7;
  void *pvVar25;
  ulong uVar26;
  float fVar27;
  float fVar28;
  ulong local_90;
  void *local_68;
  void *local_60;
  void *local_58;
  ulong local_50;
  
  if (8 < (uint)this->op_type) {
    return 0;
  }
  pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  switch(this->op_type) {
  case 0:
    uVar1 = pMVar7->w;
    uVar19 = (ulong)uVar1;
    sVar8 = pMVar7->elemsize;
    uVar2 = pMVar7[1].w;
    uVar24 = (ulong)uVar2;
    uVar3 = pMVar7[1].h;
    uVar4 = pMVar7[1].c;
    uVar21 = (ulong)uVar4;
    iVar5 = pMVar7->dims;
    if (iVar5 != 1) {
      uVar14 = pMVar7->h;
      uVar16 = uVar14 * uVar1;
      if (iVar5 != 2) {
        if (iVar5 != 3) {
          return 0;
        }
        uVar6 = pMVar7->c;
        uVar21 = (ulong)uVar6;
        Mat::create(this_00,uVar1,uVar14,uVar6,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        iVar5 = pMVar7[1].dims;
        if (iVar5 != 1) {
          if (iVar5 == 3) {
            if (((uVar2 == 1) && (uVar3 == 1)) && (uVar4 == uVar6)) {
              if (0 < (int)uVar6) {
                pvVar17 = pMVar7->data;
                sVar9 = pMVar7->elemsize;
                pvVar22 = pMVar7[1].data;
                sVar10 = pMVar7[1].elemsize;
                sVar11 = pMVar7[1].cstep;
                sVar12 = this_00->elemsize;
                sVar13 = pMVar7->cstep;
                uVar24 = 0;
                do {
                  if (0 < (int)uVar16) {
                    uVar19 = 0;
                    do {
                      *(float *)((long)pvVar15 + uVar19 * 4) =
                           *(float *)((long)pvVar22 + sVar10 * sVar11 * uVar24) +
                           *(float *)((long)pvVar17 + uVar19 * 4);
                      uVar19 = uVar19 + 1;
                    } while (uVar16 != uVar19);
                  }
                  uVar24 = uVar24 + 1;
                  pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
                  pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar13);
                } while (uVar24 != uVar21);
                return 0;
              }
              return 0;
            }
            if ((uVar2 == uVar1) && (uVar4 == 1 && uVar14 == uVar3)) {
              if (0 < (int)uVar6) {
                pvVar17 = pMVar7->data;
                sVar9 = pMVar7->elemsize;
                pvVar22 = pMVar7[1].data;
                sVar10 = this_00->elemsize;
                sVar11 = pMVar7->cstep;
                uVar24 = 0;
                do {
                  if (0 < (int)uVar16) {
                    uVar19 = 0;
                    do {
                      *(float *)((long)pvVar15 + uVar19 * 4) =
                           *(float *)((long)pvVar22 + uVar19 * 4) +
                           *(float *)((long)pvVar17 + uVar19 * 4);
                      uVar19 = uVar19 + 1;
                    } while (uVar16 != uVar19);
                  }
                  uVar24 = uVar24 + 1;
                  pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
                  pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
                } while (uVar24 != uVar21);
                return 0;
              }
              return 0;
            }
            if (0 < (int)uVar6) {
              pvVar17 = pMVar7->data;
              sVar9 = pMVar7->elemsize;
              pvVar22 = pMVar7[1].data;
              sVar10 = pMVar7[1].elemsize;
              sVar11 = this_00->elemsize;
              sVar12 = pMVar7[1].cstep;
              sVar13 = pMVar7->cstep;
              uVar24 = 0;
              do {
                if (0 < (int)uVar16) {
                  uVar19 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar19 * 4) =
                         *(float *)((long)pvVar22 + uVar19 * 4) +
                         *(float *)((long)pvVar17 + uVar19 * 4);
                    uVar19 = uVar19 + 1;
                  } while (uVar16 != uVar19);
                }
                uVar24 = uVar24 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
                pvVar22 = (void *)((long)pvVar22 + sVar10 * sVar12);
                pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar13);
              } while (uVar24 != uVar21);
              return 0;
            }
            return 0;
          }
          if (iVar5 != 2) {
            return 0;
          }
          if (0 < (int)uVar6) {
            pvVar17 = pMVar7->data;
            sVar9 = pMVar7->elemsize;
            iVar5 = pMVar7[1].w;
            sVar10 = pMVar7[1].elemsize;
            pvVar22 = pMVar7[1].data;
            sVar11 = this_00->elemsize;
            lVar23 = (long)(int)uVar1 * 4;
            sVar12 = pMVar7->cstep;
            uVar24 = 0;
            do {
              if (0 < (int)uVar14) {
                uVar26 = 0;
                pvVar18 = pvVar17;
                pvVar25 = pvVar15;
                do {
                  if (0 < (int)uVar1) {
                    fVar28 = *(float *)((long)pvVar22 + uVar26 * 4 + (long)iVar5 * sVar10 * uVar24);
                    uVar20 = 0;
                    do {
                      *(float *)((long)pvVar25 + uVar20 * 4) =
                           *(float *)((long)pvVar18 + uVar20 * 4) + fVar28;
                      uVar20 = uVar20 + 1;
                    } while (uVar19 != uVar20);
                  }
                  uVar26 = uVar26 + 1;
                  pvVar25 = (void *)((long)pvVar25 + lVar23);
                  pvVar18 = (void *)((long)pvVar18 + lVar23);
                } while (uVar26 != uVar14);
              }
              uVar24 = uVar24 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
              pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar12);
            } while (uVar24 != uVar21);
            return 0;
          }
          return 0;
        }
        if (pMVar7[1].w != 1) {
          if (0 < (int)uVar6) {
            pvVar17 = pMVar7->data;
            sVar9 = pMVar7->elemsize;
            pvVar22 = pMVar7[1].data;
            sVar10 = this_00->elemsize;
            sVar11 = pMVar7->cstep;
            uVar24 = 0;
            do {
              if (0 < (int)uVar16) {
                fVar28 = *(float *)((long)pvVar22 + uVar24 * 4);
                uVar19 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar19 * 4) =
                       *(float *)((long)pvVar17 + uVar19 * 4) + fVar28;
                  uVar19 = uVar19 + 1;
                } while (uVar16 != uVar19);
              }
              uVar24 = uVar24 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
              pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
            } while (uVar24 != uVar21);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar6) {
          fVar28 = *pMVar7[1].data;
          pvVar17 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          sVar10 = this_00->elemsize;
          sVar11 = pMVar7->cstep;
          uVar24 = 0;
          do {
            if (0 < (int)uVar16) {
              uVar19 = 0;
              do {
                *(float *)((long)pvVar15 + uVar19 * 4) =
                     *(float *)((long)pvVar17 + uVar19 * 4) + fVar28;
                uVar19 = uVar19 + 1;
              } while (uVar16 != uVar19);
            }
            uVar24 = uVar24 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
            pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
          } while (uVar24 != uVar21);
          return 0;
        }
        return 0;
      }
      if (pMVar7[1].dims == 3) {
        Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 != 0) {
          if (0 < (int)uVar4) {
            pvVar17 = pMVar7->data;
            pvVar22 = pMVar7[1].data;
            iVar5 = pMVar7->w;
            sVar9 = pMVar7->elemsize;
            sVar10 = pMVar7[1].elemsize;
            sVar11 = this_00->elemsize;
            lVar23 = (long)(int)uVar2 * 4;
            sVar12 = pMVar7[1].cstep;
            uVar19 = 0;
            do {
              if (0 < (int)uVar3) {
                uVar26 = 0;
                pvVar18 = pvVar15;
                pvVar25 = pvVar22;
                do {
                  if (0 < (int)uVar2) {
                    fVar28 = *(float *)((long)pvVar17 + uVar26 * 4 + (long)iVar5 * sVar9 * uVar19);
                    uVar20 = 0;
                    do {
                      *(float *)((long)pvVar18 + uVar20 * 4) =
                           *(float *)((long)pvVar25 + uVar20 * 4) + fVar28;
                      uVar20 = uVar20 + 1;
                    } while (uVar24 != uVar20);
                  }
                  uVar26 = uVar26 + 1;
                  pvVar18 = (void *)((long)pvVar18 + lVar23);
                  pvVar25 = (void *)((long)pvVar25 + lVar23);
                } while (uVar26 != uVar3);
              }
              uVar19 = uVar19 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
              pvVar22 = (void *)((long)pvVar22 + sVar10 * sVar12);
            } while (uVar19 != uVar21);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(this_00,uVar1,uVar14,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar7[1].dims != 1) {
        if (pMVar7[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar16) {
          pvVar17 = pMVar7->data;
          pvVar22 = pMVar7[1].data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) =
                 *(float *)((long)pvVar22 + uVar21 * 4) + *(float *)((long)pvVar17 + uVar21 * 4);
            uVar21 = uVar21 + 1;
          } while (uVar16 != uVar21);
          return 0;
        }
        return 0;
      }
      Mat::create(this_00,uVar1,uVar14,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (pMVar7[1].w != 1) {
          if (0 < (int)uVar14) {
            pvVar17 = pMVar7->data;
            pvVar22 = pMVar7[1].data;
            lVar23 = (long)(int)uVar1 * 4;
            uVar21 = 0;
            do {
              if (0 < (int)uVar1) {
                fVar28 = *(float *)((long)pvVar22 + uVar21 * 4);
                uVar24 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar24 * 4) =
                       *(float *)((long)pvVar17 + uVar24 * 4) + fVar28;
                  uVar24 = uVar24 + 1;
                } while (uVar19 != uVar24);
              }
              uVar21 = uVar21 + 1;
              pvVar15 = (void *)((long)pvVar15 + lVar23);
              pvVar17 = (void *)((long)pvVar17 + lVar23);
            } while (uVar21 != uVar14);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar16) {
          fVar28 = *pMVar7[1].data;
          pvVar17 = pMVar7->data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) = *(float *)((long)pvVar17 + uVar21 * 4) + fVar28
            ;
            uVar21 = uVar21 + 1;
          } while (uVar16 != uVar21);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    uVar14 = uVar3 * uVar2;
    iVar5 = pMVar7[1].dims;
    if (uVar1 != 1) {
      if (iVar5 == 1) {
        Mat::create(this_00,uVar1,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].w != 1) {
          if (0 < (int)uVar1) {
            pvVar17 = pMVar7->data;
            pvVar22 = pMVar7[1].data;
            uVar21 = 0;
            do {
              *(float *)((long)pvVar15 + uVar21 * 4) =
                   *(float *)((long)pvVar22 + uVar21 * 4) + *(float *)((long)pvVar17 + uVar21 * 4);
              uVar21 = uVar21 + 1;
            } while (uVar19 != uVar21);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar1) {
          fVar28 = *pMVar7[1].data;
          pvVar17 = pMVar7->data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) = *(float *)((long)pvVar17 + uVar21 * 4) + fVar28
            ;
            uVar21 = uVar21 + 1;
          } while (uVar19 != uVar21);
          return 0;
        }
        return 0;
      }
      if (iVar5 == 2) {
        Mat::create(this_00,uVar2,uVar3,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar3) {
            pvVar17 = pMVar7->data;
            pvVar22 = pMVar7[1].data;
            lVar23 = (long)(int)uVar2 * 4;
            uVar21 = 0;
            do {
              if (0 < (int)uVar2) {
                fVar28 = *(float *)((long)pvVar17 + uVar21 * 4);
                uVar19 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar19 * 4) =
                       *(float *)((long)pvVar22 + uVar19 * 4) + fVar28;
                  uVar19 = uVar19 + 1;
                } while (uVar24 != uVar19);
              }
              uVar21 = uVar21 + 1;
              pvVar15 = (void *)((long)pvVar15 + lVar23);
              pvVar22 = (void *)((long)pvVar22 + lVar23);
            } while (uVar21 != uVar3);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar5 != 3) {
        return 0;
      }
      Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 != (void *)0x0) {
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if (0 < (int)uVar4) {
          pvVar17 = pMVar7->data;
          pvVar22 = pMVar7[1].data;
          sVar9 = pMVar7[1].elemsize;
          sVar10 = this_00->elemsize;
          sVar11 = pMVar7[1].cstep;
          uVar24 = 0;
          do {
            if (0 < (int)uVar14) {
              fVar28 = *(float *)((long)pvVar17 + uVar24 * 4);
              uVar19 = 0;
              do {
                *(float *)((long)pvVar15 + uVar19 * 4) =
                     *(float *)((long)pvVar22 + uVar19 * 4) + fVar28;
                uVar19 = uVar19 + 1;
              } while (uVar14 != uVar19);
            }
            uVar24 = uVar24 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
            pvVar22 = (void *)((long)pvVar22 + sVar9 * sVar11);
          } while (uVar24 != uVar21);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (iVar5 == 1) {
      Mat::create(this_00,uVar2,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)uVar2) {
          fVar28 = *pMVar7->data;
          pvVar17 = pMVar7[1].data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) = *(float *)((long)pvVar17 + uVar21 * 4) + fVar28
            ;
            uVar21 = uVar21 + 1;
          } while (uVar24 != uVar21);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (iVar5 == 2) {
      Mat::create(this_00,uVar2,uVar3,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (0 < (int)uVar14) {
          fVar28 = *pMVar7->data;
          pvVar17 = pMVar7[1].data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) = *(float *)((long)pvVar17 + uVar21 * 4) + fVar28
            ;
            uVar21 = uVar21 + 1;
          } while (uVar14 != uVar21);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    if (iVar5 != 3) {
      return 0;
    }
    Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
    pvVar15 = this_00->data;
    if (pvVar15 == (void *)0x0) {
      return -100;
    }
    sVar8 = this_00->cstep;
    if ((long)this_00->c * sVar8 == 0) {
      return -100;
    }
    if (0 < (int)uVar4) {
      fVar28 = *pMVar7->data;
      pvVar17 = pMVar7[1].data;
      sVar9 = pMVar7[1].elemsize;
      sVar10 = this_00->elemsize;
      sVar11 = pMVar7[1].cstep;
      uVar24 = 0;
      do {
        if (0 < (int)uVar14) {
          uVar19 = 0;
          do {
            *(float *)((long)pvVar15 + uVar19 * 4) = *(float *)((long)pvVar17 + uVar19 * 4) + fVar28
            ;
            uVar19 = uVar19 + 1;
          } while (uVar14 != uVar19);
        }
        uVar24 = uVar24 + 1;
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
        pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
      } while (uVar24 != uVar21);
      return 0;
    }
    return 0;
  case 1:
    uVar1 = pMVar7->w;
    uVar19 = (ulong)uVar1;
    sVar8 = pMVar7->elemsize;
    uVar2 = pMVar7[1].w;
    uVar24 = (ulong)uVar2;
    uVar3 = pMVar7[1].h;
    uVar4 = pMVar7[1].c;
    uVar21 = (ulong)uVar4;
    iVar5 = pMVar7->dims;
    if (iVar5 == 1) {
      uVar14 = uVar3 * uVar2;
      iVar5 = pMVar7[1].dims;
      if (uVar1 != 1) {
        if (iVar5 == 1) {
          Mat::create(this_00,uVar1,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (pMVar7[1].w == 1) {
            if (0 < (int)uVar1) {
              fVar28 = *pMVar7[1].data;
              pvVar17 = pMVar7->data;
              uVar21 = 0;
              do {
                *(float *)((long)pvVar15 + uVar21 * 4) =
                     *(float *)((long)pvVar17 + uVar21 * 4) - fVar28;
                uVar21 = uVar21 + 1;
              } while (uVar19 != uVar21);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar1) {
            pvVar17 = pMVar7->data;
            pvVar22 = pMVar7[1].data;
            uVar21 = 0;
            do {
              *(float *)((long)pvVar15 + uVar21 * 4) =
                   *(float *)((long)pvVar17 + uVar21 * 4) - *(float *)((long)pvVar22 + uVar21 * 4);
              uVar21 = uVar21 + 1;
            } while (uVar19 != uVar21);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 2) {
          Mat::create(this_00,uVar2,uVar3,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              pvVar17 = pMVar7->data;
              pvVar22 = pMVar7[1].data;
              lVar23 = (long)(int)uVar2 * 4;
              uVar21 = 0;
              do {
                if (0 < (int)uVar2) {
                  fVar28 = *(float *)((long)pvVar17 + uVar21 * 4);
                  uVar19 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar19 * 4) =
                         fVar28 - *(float *)((long)pvVar22 + uVar19 * 4);
                    uVar19 = uVar19 + 1;
                  } while (uVar24 != uVar19);
                }
                uVar21 = uVar21 + 1;
                pvVar15 = (void *)((long)pvVar15 + lVar23);
                pvVar22 = (void *)((long)pvVar22 + lVar23);
              } while (uVar21 != uVar3);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 != (void *)0x0) {
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if (0 < (int)uVar4) {
            pvVar17 = pMVar7->data;
            pvVar22 = pMVar7[1].data;
            sVar9 = pMVar7[1].elemsize;
            sVar10 = this_00->elemsize;
            sVar11 = pMVar7[1].cstep;
            uVar24 = 0;
            do {
              if (0 < (int)uVar14) {
                fVar28 = *(float *)((long)pvVar17 + uVar24 * 4);
                uVar19 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar19 * 4) =
                       fVar28 - *(float *)((long)pvVar22 + uVar19 * 4);
                  uVar19 = uVar19 + 1;
                } while (uVar14 != uVar19);
              }
              uVar24 = uVar24 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
              pvVar22 = (void *)((long)pvVar22 + sVar9 * sVar11);
            } while (uVar24 != uVar21);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar5 == 1) {
        Mat::create(this_00,uVar2,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        fVar28 = *pMVar7->data;
        pvVar17 = pMVar7[1].data;
        uVar21 = 0;
        do {
          *(float *)((long)pvVar15 + uVar21 * 4) = fVar28 - *(float *)((long)pvVar17 + uVar21 * 4);
          uVar21 = uVar21 + 1;
        } while (uVar24 != uVar21);
      }
      else if (iVar5 == 2) {
        Mat::create(this_00,uVar2,uVar3,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if ((int)uVar14 < 1) {
          return 0;
        }
        fVar28 = *pMVar7->data;
        pvVar17 = pMVar7[1].data;
        uVar21 = 0;
        do {
          *(float *)((long)pvVar15 + uVar21 * 4) = fVar28 - *(float *)((long)pvVar17 + uVar21 * 4);
          uVar21 = uVar21 + 1;
        } while (uVar14 != uVar21);
      }
      else if (iVar5 == 3) {
        Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 != 0) {
          if (0 < (int)uVar4) {
            fVar28 = *pMVar7->data;
            pvVar17 = pMVar7[1].data;
            sVar9 = pMVar7[1].elemsize;
            sVar10 = this_00->elemsize;
            sVar11 = pMVar7[1].cstep;
            uVar24 = 0;
            do {
              if (0 < (int)uVar14) {
                uVar19 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar19 * 4) =
                       fVar28 - *(float *)((long)pvVar17 + uVar19 * 4);
                  uVar19 = uVar19 + 1;
                } while (uVar14 != uVar19);
              }
              uVar24 = uVar24 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
              pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
            } while (uVar24 != uVar21);
            return 0;
          }
          return 0;
        }
        return -100;
      }
    }
    else {
      uVar14 = pMVar7->h;
      uVar16 = uVar14 * uVar1;
      if (iVar5 == 2) {
        if (pMVar7[1].dims == 3) {
          Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 != 0) {
            if (0 < (int)uVar4) {
              pvVar17 = pMVar7->data;
              pvVar22 = pMVar7[1].data;
              iVar5 = pMVar7->w;
              sVar9 = pMVar7->elemsize;
              sVar10 = pMVar7[1].elemsize;
              sVar11 = this_00->elemsize;
              lVar23 = (long)(int)uVar2 * 4;
              sVar12 = pMVar7[1].cstep;
              uVar19 = 0;
              do {
                if (0 < (int)uVar3) {
                  uVar26 = 0;
                  pvVar18 = pvVar15;
                  pvVar25 = pvVar22;
                  do {
                    if (0 < (int)uVar2) {
                      fVar28 = *(float *)((long)pvVar17 + uVar26 * 4 + (long)iVar5 * sVar9 * uVar19)
                      ;
                      uVar20 = 0;
                      do {
                        *(float *)((long)pvVar18 + uVar20 * 4) =
                             fVar28 - *(float *)((long)pvVar25 + uVar20 * 4);
                        uVar20 = uVar20 + 1;
                      } while (uVar24 != uVar20);
                    }
                    uVar26 = uVar26 + 1;
                    pvVar18 = (void *)((long)pvVar18 + lVar23);
                    pvVar25 = (void *)((long)pvVar25 + lVar23);
                  } while (uVar26 != uVar3);
                }
                uVar19 = uVar19 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
                pvVar22 = (void *)((long)pvVar22 + sVar10 * sVar12);
              } while (uVar19 != uVar21);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(this_00,uVar1,uVar14,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].dims == 1) {
          Mat::create(this_00,uVar1,uVar14,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (pMVar7[1].w != 1) {
            if (0 < (int)uVar14) {
              pvVar17 = pMVar7->data;
              pvVar22 = pMVar7[1].data;
              lVar23 = (long)(int)uVar1 * 4;
              uVar21 = 0;
              do {
                if (0 < (int)uVar1) {
                  fVar28 = *(float *)((long)pvVar22 + uVar21 * 4);
                  uVar24 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar24 * 4) =
                         *(float *)((long)pvVar17 + uVar24 * 4) - fVar28;
                    uVar24 = uVar24 + 1;
                  } while (uVar19 != uVar24);
                }
                uVar21 = uVar21 + 1;
                pvVar15 = (void *)((long)pvVar15 + lVar23);
                pvVar17 = (void *)((long)pvVar17 + lVar23);
              } while (uVar21 != uVar14);
              return 0;
            }
            return 0;
          }
          if ((int)uVar16 < 1) {
            return 0;
          }
          fVar28 = *pMVar7[1].data;
          pvVar17 = pMVar7->data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) = *(float *)((long)pvVar17 + uVar21 * 4) - fVar28
            ;
            uVar21 = uVar21 + 1;
          } while (uVar16 != uVar21);
        }
        else if (pMVar7[1].dims == 2) {
          if ((int)uVar16 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          pvVar22 = pMVar7[1].data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) =
                 *(float *)((long)pvVar17 + uVar21 * 4) - *(float *)((long)pvVar22 + uVar21 * 4);
            uVar21 = uVar21 + 1;
          } while (uVar16 != uVar21);
        }
      }
      else {
        if (iVar5 != 3) {
          return 0;
        }
        uVar6 = pMVar7->c;
        uVar21 = (ulong)uVar6;
        Mat::create(this_00,uVar1,uVar14,uVar6,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        iVar5 = pMVar7[1].dims;
        if (iVar5 == 1) {
          if (pMVar7[1].w != 1) {
            if (0 < (int)uVar6) {
              pvVar17 = pMVar7->data;
              sVar9 = pMVar7->elemsize;
              pvVar22 = pMVar7[1].data;
              sVar10 = this_00->elemsize;
              sVar11 = pMVar7->cstep;
              uVar24 = 0;
              do {
                if (0 < (int)uVar16) {
                  fVar28 = *(float *)((long)pvVar22 + uVar24 * 4);
                  uVar19 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar19 * 4) =
                         *(float *)((long)pvVar17 + uVar19 * 4) - fVar28;
                    uVar19 = uVar19 + 1;
                  } while (uVar16 != uVar19);
                }
                uVar24 = uVar24 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
                pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
              } while (uVar24 != uVar21);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar6) {
            fVar28 = *pMVar7[1].data;
            pvVar17 = pMVar7->data;
            sVar9 = pMVar7->elemsize;
            sVar10 = this_00->elemsize;
            sVar11 = pMVar7->cstep;
            uVar24 = 0;
            do {
              if (0 < (int)uVar16) {
                uVar19 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar19 * 4) =
                       *(float *)((long)pvVar17 + uVar19 * 4) - fVar28;
                  uVar19 = uVar19 + 1;
                } while (uVar16 != uVar19);
              }
              uVar24 = uVar24 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
              pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
            } while (uVar24 != uVar21);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 3) {
          if (((uVar2 == 1) && (uVar3 == 1)) && (uVar4 == uVar6)) {
            if (0 < (int)uVar6) {
              pvVar17 = pMVar7->data;
              sVar9 = pMVar7->elemsize;
              pvVar22 = pMVar7[1].data;
              sVar10 = pMVar7[1].elemsize;
              sVar11 = pMVar7[1].cstep;
              sVar12 = this_00->elemsize;
              sVar13 = pMVar7->cstep;
              uVar24 = 0;
              do {
                if (0 < (int)uVar16) {
                  uVar19 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar19 * 4) =
                         *(float *)((long)pvVar17 + uVar19 * 4) -
                         *(float *)((long)pvVar22 + sVar10 * sVar11 * uVar24);
                    uVar19 = uVar19 + 1;
                  } while (uVar16 != uVar19);
                }
                uVar24 = uVar24 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
                pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar13);
              } while (uVar24 != uVar21);
              return 0;
            }
            return 0;
          }
          if ((uVar2 == uVar1) && (uVar4 == 1 && uVar14 == uVar3)) {
            if (0 < (int)uVar6) {
              pvVar17 = pMVar7->data;
              sVar9 = pMVar7->elemsize;
              pvVar22 = pMVar7[1].data;
              sVar10 = this_00->elemsize;
              sVar11 = pMVar7->cstep;
              uVar24 = 0;
              do {
                if (0 < (int)uVar16) {
                  uVar19 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar19 * 4) =
                         *(float *)((long)pvVar17 + uVar19 * 4) -
                         *(float *)((long)pvVar22 + uVar19 * 4);
                    uVar19 = uVar19 + 1;
                  } while (uVar16 != uVar19);
                }
                uVar24 = uVar24 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
                pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
              } while (uVar24 != uVar21);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar6) {
            pvVar17 = pMVar7->data;
            sVar9 = pMVar7->elemsize;
            pvVar22 = pMVar7[1].data;
            sVar10 = pMVar7[1].elemsize;
            sVar11 = this_00->elemsize;
            sVar12 = pMVar7[1].cstep;
            sVar13 = pMVar7->cstep;
            uVar24 = 0;
            do {
              if (0 < (int)uVar16) {
                uVar19 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar19 * 4) =
                       *(float *)((long)pvVar17 + uVar19 * 4) -
                       *(float *)((long)pvVar22 + uVar19 * 4);
                  uVar19 = uVar19 + 1;
                } while (uVar16 != uVar19);
              }
              uVar24 = uVar24 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
              pvVar22 = (void *)((long)pvVar22 + sVar10 * sVar12);
              pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar13);
            } while (uVar24 != uVar21);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 2) {
          if (0 < (int)uVar6) {
            pvVar17 = pMVar7->data;
            sVar9 = pMVar7->elemsize;
            iVar5 = pMVar7[1].w;
            sVar10 = pMVar7[1].elemsize;
            pvVar22 = pMVar7[1].data;
            sVar11 = this_00->elemsize;
            lVar23 = (long)(int)uVar1 * 4;
            sVar12 = pMVar7->cstep;
            uVar24 = 0;
            do {
              if (0 < (int)uVar14) {
                uVar26 = 0;
                pvVar18 = pvVar17;
                pvVar25 = pvVar15;
                do {
                  if (0 < (int)uVar1) {
                    fVar28 = *(float *)((long)pvVar22 + uVar26 * 4 + (long)iVar5 * sVar10 * uVar24);
                    uVar20 = 0;
                    do {
                      *(float *)((long)pvVar25 + uVar20 * 4) =
                           *(float *)((long)pvVar18 + uVar20 * 4) - fVar28;
                      uVar20 = uVar20 + 1;
                    } while (uVar19 != uVar20);
                  }
                  uVar26 = uVar26 + 1;
                  pvVar25 = (void *)((long)pvVar25 + lVar23);
                  pvVar18 = (void *)((long)pvVar18 + lVar23);
                } while (uVar26 != uVar14);
              }
              uVar24 = uVar24 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
              pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar12);
            } while (uVar24 != uVar21);
            return 0;
          }
          return 0;
        }
      }
    }
    return 0;
  case 2:
    uVar1 = pMVar7->w;
    uVar19 = (ulong)uVar1;
    sVar8 = pMVar7->elemsize;
    uVar2 = pMVar7[1].w;
    uVar24 = (ulong)uVar2;
    uVar3 = pMVar7[1].h;
    uVar4 = pMVar7[1].c;
    uVar21 = (ulong)uVar4;
    iVar5 = pMVar7->dims;
    if (iVar5 == 1) {
      uVar14 = uVar3 * uVar2;
      iVar5 = pMVar7[1].dims;
      if (uVar1 == 1) {
        if (iVar5 == 1) {
          Mat::create(this_00,uVar2,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          fVar28 = *pMVar7->data;
          pvVar17 = pMVar7[1].data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) = *(float *)((long)pvVar17 + uVar21 * 4) * fVar28
            ;
            uVar21 = uVar21 + 1;
          } while (uVar24 != uVar21);
        }
        else if (iVar5 == 2) {
          Mat::create(this_00,uVar2,uVar3,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar14 < 1) {
            return 0;
          }
          fVar28 = *pMVar7->data;
          pvVar17 = pMVar7[1].data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) = *(float *)((long)pvVar17 + uVar21 * 4) * fVar28
            ;
            uVar21 = uVar21 + 1;
          } while (uVar14 != uVar21);
        }
        else if (iVar5 == 3) {
          Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 != 0) {
            if (0 < (int)uVar4) {
              fVar28 = *pMVar7->data;
              pvVar17 = pMVar7[1].data;
              sVar9 = pMVar7[1].elemsize;
              sVar10 = this_00->elemsize;
              sVar11 = pMVar7[1].cstep;
              uVar24 = 0;
              do {
                if (0 < (int)uVar14) {
                  uVar19 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar19 * 4) =
                         *(float *)((long)pvVar17 + uVar19 * 4) * fVar28;
                    uVar19 = uVar19 + 1;
                  } while (uVar14 != uVar19);
                }
                uVar24 = uVar24 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
                pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
              } while (uVar24 != uVar21);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else if (iVar5 == 1) {
        Mat::create(this_00,uVar1,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].w == 1) {
          if ((int)uVar1 < 1) {
            return 0;
          }
          fVar28 = *pMVar7[1].data;
          pvVar17 = pMVar7->data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) = *(float *)((long)pvVar17 + uVar21 * 4) * fVar28
            ;
            uVar21 = uVar21 + 1;
          } while (uVar19 != uVar21);
        }
        else {
          if ((int)uVar1 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          pvVar22 = pMVar7[1].data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) =
                 *(float *)((long)pvVar22 + uVar21 * 4) * *(float *)((long)pvVar17 + uVar21 * 4);
            uVar21 = uVar21 + 1;
          } while (uVar19 != uVar21);
        }
      }
      else {
        if (iVar5 == 2) {
          Mat::create(this_00,uVar2,uVar3,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              pvVar17 = pMVar7->data;
              pvVar22 = pMVar7[1].data;
              lVar23 = (long)(int)uVar2 * 4;
              uVar21 = 0;
              do {
                if (0 < (int)uVar2) {
                  fVar28 = *(float *)((long)pvVar17 + uVar21 * 4);
                  uVar19 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar19 * 4) =
                         *(float *)((long)pvVar22 + uVar19 * 4) * fVar28;
                    uVar19 = uVar19 + 1;
                  } while (uVar24 != uVar19);
                }
                uVar21 = uVar21 + 1;
                pvVar15 = (void *)((long)pvVar15 + lVar23);
                pvVar22 = (void *)((long)pvVar22 + lVar23);
              } while (uVar21 != uVar3);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 == 3) {
          Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 != 0) {
            if (0 < (int)uVar4) {
              pvVar17 = pMVar7->data;
              pvVar22 = pMVar7[1].data;
              sVar9 = pMVar7[1].elemsize;
              sVar10 = this_00->elemsize;
              sVar11 = pMVar7[1].cstep;
              uVar24 = 0;
              do {
                if (0 < (int)uVar14) {
                  fVar28 = *(float *)((long)pvVar17 + uVar24 * 4);
                  uVar19 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar19 * 4) =
                         *(float *)((long)pvVar22 + uVar19 * 4) * fVar28;
                    uVar19 = uVar19 + 1;
                  } while (uVar14 != uVar19);
                }
                uVar24 = uVar24 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
                pvVar22 = (void *)((long)pvVar22 + sVar9 * sVar11);
              } while (uVar24 != uVar21);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
    }
    else {
      uVar14 = pMVar7->h;
      uVar16 = uVar14 * uVar1;
      if (iVar5 == 2) {
        if (pMVar7[1].dims == 3) {
          Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 != 0) {
            if (0 < (int)uVar4) {
              pvVar17 = pMVar7->data;
              pvVar22 = pMVar7[1].data;
              iVar5 = pMVar7->w;
              sVar9 = pMVar7->elemsize;
              sVar10 = pMVar7[1].elemsize;
              sVar11 = this_00->elemsize;
              lVar23 = (long)(int)uVar2 * 4;
              sVar12 = pMVar7[1].cstep;
              uVar19 = 0;
              do {
                if (0 < (int)uVar3) {
                  uVar26 = 0;
                  pvVar18 = pvVar15;
                  pvVar25 = pvVar22;
                  do {
                    if (0 < (int)uVar2) {
                      fVar28 = *(float *)((long)pvVar17 + uVar26 * 4 + (long)iVar5 * sVar9 * uVar19)
                      ;
                      uVar20 = 0;
                      do {
                        *(float *)((long)pvVar18 + uVar20 * 4) =
                             *(float *)((long)pvVar25 + uVar20 * 4) * fVar28;
                        uVar20 = uVar20 + 1;
                      } while (uVar24 != uVar20);
                    }
                    uVar26 = uVar26 + 1;
                    pvVar18 = (void *)((long)pvVar18 + lVar23);
                    pvVar25 = (void *)((long)pvVar25 + lVar23);
                  } while (uVar26 != uVar3);
                }
                uVar19 = uVar19 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
                pvVar22 = (void *)((long)pvVar22 + sVar10 * sVar12);
              } while (uVar19 != uVar21);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(this_00,uVar1,uVar14,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].dims == 1) {
          Mat::create(this_00,uVar1,uVar14,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (pMVar7[1].w != 1) {
            if (0 < (int)uVar14) {
              pvVar17 = pMVar7->data;
              pvVar22 = pMVar7[1].data;
              lVar23 = (long)(int)uVar1 * 4;
              uVar21 = 0;
              do {
                if (0 < (int)uVar1) {
                  fVar28 = *(float *)((long)pvVar22 + uVar21 * 4);
                  uVar24 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar24 * 4) =
                         *(float *)((long)pvVar17 + uVar24 * 4) * fVar28;
                    uVar24 = uVar24 + 1;
                  } while (uVar19 != uVar24);
                }
                uVar21 = uVar21 + 1;
                pvVar15 = (void *)((long)pvVar15 + lVar23);
                pvVar17 = (void *)((long)pvVar17 + lVar23);
              } while (uVar21 != uVar14);
              return 0;
            }
            return 0;
          }
          if ((int)uVar16 < 1) {
            return 0;
          }
          fVar28 = *pMVar7[1].data;
          pvVar17 = pMVar7->data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) = *(float *)((long)pvVar17 + uVar21 * 4) * fVar28
            ;
            uVar21 = uVar21 + 1;
          } while (uVar16 != uVar21);
        }
        else if (pMVar7[1].dims == 2) {
          if ((int)uVar16 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          pvVar22 = pMVar7[1].data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) =
                 *(float *)((long)pvVar22 + uVar21 * 4) * *(float *)((long)pvVar17 + uVar21 * 4);
            uVar21 = uVar21 + 1;
          } while (uVar16 != uVar21);
        }
      }
      else if (iVar5 == 3) {
        uVar6 = pMVar7->c;
        uVar21 = (ulong)uVar6;
        Mat::create(this_00,uVar1,uVar14,uVar6,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        iVar5 = pMVar7[1].dims;
        if (iVar5 == 1) {
          if (pMVar7[1].w != 1) {
            if (0 < (int)uVar6) {
              pvVar17 = pMVar7->data;
              sVar9 = pMVar7->elemsize;
              pvVar22 = pMVar7[1].data;
              sVar10 = this_00->elemsize;
              sVar11 = pMVar7->cstep;
              uVar24 = 0;
              do {
                if (0 < (int)uVar16) {
                  fVar28 = *(float *)((long)pvVar22 + uVar24 * 4);
                  uVar19 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar19 * 4) =
                         *(float *)((long)pvVar17 + uVar19 * 4) * fVar28;
                    uVar19 = uVar19 + 1;
                  } while (uVar16 != uVar19);
                }
                uVar24 = uVar24 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
                pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
              } while (uVar24 != uVar21);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar6) {
            fVar28 = *pMVar7[1].data;
            pvVar17 = pMVar7->data;
            sVar9 = pMVar7->elemsize;
            sVar10 = this_00->elemsize;
            sVar11 = pMVar7->cstep;
            uVar24 = 0;
            do {
              if (0 < (int)uVar16) {
                uVar19 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar19 * 4) =
                       *(float *)((long)pvVar17 + uVar19 * 4) * fVar28;
                  uVar19 = uVar19 + 1;
                } while (uVar16 != uVar19);
              }
              uVar24 = uVar24 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
              pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
            } while (uVar24 != uVar21);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 3) {
          if (((uVar2 == 1) && (uVar3 == 1)) && (uVar4 == uVar6)) {
            if (0 < (int)uVar6) {
              pvVar17 = pMVar7->data;
              sVar9 = pMVar7->elemsize;
              pvVar22 = pMVar7[1].data;
              sVar10 = pMVar7[1].elemsize;
              sVar11 = pMVar7[1].cstep;
              sVar12 = this_00->elemsize;
              sVar13 = pMVar7->cstep;
              uVar24 = 0;
              do {
                if (0 < (int)uVar16) {
                  uVar19 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar19 * 4) =
                         *(float *)((long)pvVar22 + sVar10 * sVar11 * uVar24) *
                         *(float *)((long)pvVar17 + uVar19 * 4);
                    uVar19 = uVar19 + 1;
                  } while (uVar16 != uVar19);
                }
                uVar24 = uVar24 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
                pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar13);
              } while (uVar24 != uVar21);
              return 0;
            }
            return 0;
          }
          if ((uVar2 == uVar1) && (uVar4 == 1 && uVar14 == uVar3)) {
            if (0 < (int)uVar6) {
              pvVar17 = pMVar7->data;
              sVar9 = pMVar7->elemsize;
              pvVar22 = pMVar7[1].data;
              sVar10 = this_00->elemsize;
              sVar11 = pMVar7->cstep;
              uVar24 = 0;
              do {
                if (0 < (int)uVar16) {
                  uVar19 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar19 * 4) =
                         *(float *)((long)pvVar22 + uVar19 * 4) *
                         *(float *)((long)pvVar17 + uVar19 * 4);
                    uVar19 = uVar19 + 1;
                  } while (uVar16 != uVar19);
                }
                uVar24 = uVar24 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
                pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
              } while (uVar24 != uVar21);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar6) {
            pvVar17 = pMVar7->data;
            sVar9 = pMVar7->elemsize;
            pvVar22 = pMVar7[1].data;
            sVar10 = pMVar7[1].elemsize;
            sVar11 = this_00->elemsize;
            sVar12 = pMVar7[1].cstep;
            sVar13 = pMVar7->cstep;
            uVar24 = 0;
            do {
              if (0 < (int)uVar16) {
                uVar19 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar19 * 4) =
                       *(float *)((long)pvVar22 + uVar19 * 4) *
                       *(float *)((long)pvVar17 + uVar19 * 4);
                  uVar19 = uVar19 + 1;
                } while (uVar16 != uVar19);
              }
              uVar24 = uVar24 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
              pvVar22 = (void *)((long)pvVar22 + sVar10 * sVar12);
              pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar13);
            } while (uVar24 != uVar21);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 2) {
          if (0 < (int)uVar6) {
            pvVar17 = pMVar7->data;
            sVar9 = pMVar7->elemsize;
            iVar5 = pMVar7[1].w;
            sVar10 = pMVar7[1].elemsize;
            pvVar22 = pMVar7[1].data;
            sVar11 = this_00->elemsize;
            lVar23 = (long)(int)uVar1 * 4;
            sVar12 = pMVar7->cstep;
            uVar24 = 0;
            do {
              if (0 < (int)uVar14) {
                uVar26 = 0;
                pvVar18 = pvVar17;
                pvVar25 = pvVar15;
                do {
                  if (0 < (int)uVar1) {
                    fVar28 = *(float *)((long)pvVar22 + uVar26 * 4 + (long)iVar5 * sVar10 * uVar24);
                    uVar20 = 0;
                    do {
                      *(float *)((long)pvVar25 + uVar20 * 4) =
                           *(float *)((long)pvVar18 + uVar20 * 4) * fVar28;
                      uVar20 = uVar20 + 1;
                    } while (uVar19 != uVar20);
                  }
                  uVar26 = uVar26 + 1;
                  pvVar25 = (void *)((long)pvVar25 + lVar23);
                  pvVar18 = (void *)((long)pvVar18 + lVar23);
                } while (uVar26 != uVar14);
              }
              uVar24 = uVar24 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
              pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar12);
            } while (uVar24 != uVar21);
            return 0;
          }
          return 0;
        }
      }
    }
    break;
  case 3:
    uVar1 = pMVar7->w;
    uVar19 = (ulong)uVar1;
    sVar8 = pMVar7->elemsize;
    uVar2 = pMVar7[1].w;
    uVar24 = (ulong)uVar2;
    uVar3 = pMVar7[1].h;
    uVar4 = pMVar7[1].c;
    uVar21 = (ulong)uVar4;
    iVar5 = pMVar7->dims;
    if (iVar5 == 1) {
      uVar14 = uVar3 * uVar2;
      iVar5 = pMVar7[1].dims;
      if (uVar1 == 1) {
        if (iVar5 == 1) {
          Mat::create(this_00,uVar2,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          fVar28 = *pMVar7->data;
          pvVar17 = pMVar7[1].data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) = fVar28 / *(float *)((long)pvVar17 + uVar21 * 4)
            ;
            uVar21 = uVar21 + 1;
          } while (uVar24 != uVar21);
        }
        else if (iVar5 == 2) {
          Mat::create(this_00,uVar2,uVar3,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar14 < 1) {
            return 0;
          }
          fVar28 = *pMVar7->data;
          pvVar17 = pMVar7[1].data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) = fVar28 / *(float *)((long)pvVar17 + uVar21 * 4)
            ;
            uVar21 = uVar21 + 1;
          } while (uVar14 != uVar21);
        }
        else if (iVar5 == 3) {
          Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 != 0) {
            if (0 < (int)uVar4) {
              fVar28 = *pMVar7->data;
              pvVar17 = pMVar7[1].data;
              sVar9 = pMVar7[1].elemsize;
              sVar10 = this_00->elemsize;
              sVar11 = pMVar7[1].cstep;
              uVar24 = 0;
              do {
                if (0 < (int)uVar14) {
                  uVar19 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar19 * 4) =
                         fVar28 / *(float *)((long)pvVar17 + uVar19 * 4);
                    uVar19 = uVar19 + 1;
                  } while (uVar14 != uVar19);
                }
                uVar24 = uVar24 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
                pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
              } while (uVar24 != uVar21);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else if (iVar5 == 1) {
        Mat::create(this_00,uVar1,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].w == 1) {
          if ((int)uVar1 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          fVar28 = *pMVar7[1].data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) =
                 *(float *)((long)pvVar17 + uVar21 * 4) * (1.0 / fVar28);
            uVar21 = uVar21 + 1;
          } while (uVar19 != uVar21);
        }
        else {
          if ((int)uVar1 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          pvVar22 = pMVar7[1].data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) =
                 *(float *)((long)pvVar17 + uVar21 * 4) / *(float *)((long)pvVar22 + uVar21 * 4);
            uVar21 = uVar21 + 1;
          } while (uVar19 != uVar21);
        }
      }
      else {
        if (iVar5 == 2) {
          Mat::create(this_00,uVar2,uVar3,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              pvVar17 = pMVar7->data;
              pvVar22 = pMVar7[1].data;
              lVar23 = (long)(int)uVar2 * 4;
              uVar21 = 0;
              do {
                if (0 < (int)uVar2) {
                  fVar28 = *(float *)((long)pvVar17 + uVar21 * 4);
                  uVar19 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar19 * 4) =
                         fVar28 / *(float *)((long)pvVar22 + uVar19 * 4);
                    uVar19 = uVar19 + 1;
                  } while (uVar24 != uVar19);
                }
                uVar21 = uVar21 + 1;
                pvVar15 = (void *)((long)pvVar15 + lVar23);
                pvVar22 = (void *)((long)pvVar22 + lVar23);
              } while (uVar21 != uVar3);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 == 3) {
          Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 != 0) {
            if (0 < (int)uVar4) {
              pvVar17 = pMVar7->data;
              pvVar22 = pMVar7[1].data;
              sVar9 = pMVar7[1].elemsize;
              sVar10 = this_00->elemsize;
              sVar11 = pMVar7[1].cstep;
              uVar24 = 0;
              do {
                if (0 < (int)uVar14) {
                  fVar28 = *(float *)((long)pvVar17 + uVar24 * 4);
                  uVar19 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar19 * 4) =
                         fVar28 / *(float *)((long)pvVar22 + uVar19 * 4);
                    uVar19 = uVar19 + 1;
                  } while (uVar14 != uVar19);
                }
                uVar24 = uVar24 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
                pvVar22 = (void *)((long)pvVar22 + sVar9 * sVar11);
              } while (uVar24 != uVar21);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
    }
    else {
      uVar14 = pMVar7->h;
      uVar16 = uVar14 * uVar1;
      if (iVar5 == 2) {
        if (pMVar7[1].dims == 3) {
          Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 != 0) {
            if (0 < (int)uVar4) {
              pvVar17 = pMVar7->data;
              pvVar22 = pMVar7[1].data;
              iVar5 = pMVar7->w;
              sVar9 = pMVar7->elemsize;
              sVar10 = pMVar7[1].elemsize;
              sVar11 = this_00->elemsize;
              lVar23 = (long)(int)uVar2 * 4;
              sVar12 = pMVar7[1].cstep;
              uVar19 = 0;
              do {
                if (0 < (int)uVar3) {
                  uVar26 = 0;
                  pvVar18 = pvVar15;
                  pvVar25 = pvVar22;
                  do {
                    if (0 < (int)uVar2) {
                      fVar28 = *(float *)((long)pvVar17 + uVar26 * 4 + (long)iVar5 * sVar9 * uVar19)
                      ;
                      uVar20 = 0;
                      do {
                        *(float *)((long)pvVar18 + uVar20 * 4) =
                             fVar28 / *(float *)((long)pvVar25 + uVar20 * 4);
                        uVar20 = uVar20 + 1;
                      } while (uVar24 != uVar20);
                    }
                    uVar26 = uVar26 + 1;
                    pvVar18 = (void *)((long)pvVar18 + lVar23);
                    pvVar25 = (void *)((long)pvVar25 + lVar23);
                  } while (uVar26 != uVar3);
                }
                uVar19 = uVar19 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
                pvVar22 = (void *)((long)pvVar22 + sVar10 * sVar12);
              } while (uVar19 != uVar21);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(this_00,uVar1,uVar14,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].dims == 1) {
          Mat::create(this_00,uVar1,uVar14,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (pMVar7[1].w != 1) {
            if (0 < (int)uVar14) {
              pvVar17 = pMVar7->data;
              pvVar22 = pMVar7[1].data;
              lVar23 = (long)(int)uVar1 * 4;
              uVar21 = 0;
              do {
                if (0 < (int)uVar1) {
                  fVar28 = *(float *)((long)pvVar22 + uVar21 * 4);
                  uVar24 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar24 * 4) =
                         *(float *)((long)pvVar17 + uVar24 * 4) * (1.0 / fVar28);
                    uVar24 = uVar24 + 1;
                  } while (uVar19 != uVar24);
                }
                uVar21 = uVar21 + 1;
                pvVar15 = (void *)((long)pvVar15 + lVar23);
                pvVar17 = (void *)((long)pvVar17 + lVar23);
              } while (uVar21 != uVar14);
              return 0;
            }
            return 0;
          }
          if ((int)uVar16 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          fVar28 = *pMVar7[1].data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) =
                 *(float *)((long)pvVar17 + uVar21 * 4) * (1.0 / fVar28);
            uVar21 = uVar21 + 1;
          } while (uVar16 != uVar21);
        }
        else if (pMVar7[1].dims == 2) {
          if ((int)uVar16 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          pvVar22 = pMVar7[1].data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) =
                 *(float *)((long)pvVar17 + uVar21 * 4) / *(float *)((long)pvVar22 + uVar21 * 4);
            uVar21 = uVar21 + 1;
          } while (uVar16 != uVar21);
        }
      }
      else if (iVar5 == 3) {
        uVar6 = pMVar7->c;
        uVar21 = (ulong)uVar6;
        Mat::create(this_00,uVar1,uVar14,uVar6,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        iVar5 = pMVar7[1].dims;
        if (iVar5 == 1) {
          if (pMVar7[1].w != 1) {
            if (0 < (int)uVar6) {
              pvVar17 = pMVar7->data;
              sVar9 = pMVar7->elemsize;
              pvVar22 = pMVar7[1].data;
              sVar10 = this_00->elemsize;
              sVar11 = pMVar7->cstep;
              uVar24 = 0;
              do {
                if (0 < (int)uVar16) {
                  fVar28 = *(float *)((long)pvVar22 + uVar24 * 4);
                  uVar19 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar19 * 4) =
                         *(float *)((long)pvVar17 + uVar19 * 4) * (1.0 / fVar28);
                    uVar19 = uVar19 + 1;
                  } while (uVar16 != uVar19);
                }
                uVar24 = uVar24 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
                pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
              } while (uVar24 != uVar21);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar6) {
            pvVar17 = pMVar7->data;
            sVar9 = this_00->elemsize;
            sVar10 = pMVar7->elemsize;
            fVar28 = *pMVar7[1].data;
            sVar11 = pMVar7->cstep;
            uVar24 = 0;
            do {
              if (0 < (int)uVar16) {
                uVar19 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar19 * 4) =
                       *(float *)((long)pvVar17 + uVar19 * 4) * (1.0 / fVar28);
                  uVar19 = uVar19 + 1;
                } while (uVar16 != uVar19);
              }
              uVar24 = uVar24 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar9);
              pvVar17 = (void *)((long)pvVar17 + sVar10 * sVar11);
            } while (uVar24 != uVar21);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 3) {
          if (((uVar2 == 1) && (uVar3 == 1)) && (uVar4 == uVar6)) {
            if (0 < (int)uVar6) {
              pvVar17 = pMVar7->data;
              sVar9 = pMVar7->elemsize;
              pvVar22 = pMVar7[1].data;
              sVar10 = pMVar7[1].elemsize;
              sVar11 = pMVar7[1].cstep;
              sVar12 = this_00->elemsize;
              sVar13 = pMVar7->cstep;
              uVar24 = 0;
              do {
                if (0 < (int)uVar16) {
                  uVar19 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar19 * 4) =
                         *(float *)((long)pvVar17 + uVar19 * 4) /
                         *(float *)((long)pvVar22 + sVar10 * sVar11 * uVar24);
                    uVar19 = uVar19 + 1;
                  } while (uVar16 != uVar19);
                }
                uVar24 = uVar24 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
                pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar13);
              } while (uVar24 != uVar21);
              return 0;
            }
            return 0;
          }
          if ((uVar2 == uVar1) && (uVar4 == 1 && uVar14 == uVar3)) {
            if (0 < (int)uVar6) {
              pvVar17 = pMVar7->data;
              sVar9 = pMVar7->elemsize;
              pvVar22 = pMVar7[1].data;
              sVar10 = this_00->elemsize;
              sVar11 = pMVar7->cstep;
              uVar24 = 0;
              do {
                if (0 < (int)uVar16) {
                  uVar19 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar19 * 4) =
                         *(float *)((long)pvVar17 + uVar19 * 4) /
                         *(float *)((long)pvVar22 + uVar19 * 4);
                    uVar19 = uVar19 + 1;
                  } while (uVar16 != uVar19);
                }
                uVar24 = uVar24 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
                pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
              } while (uVar24 != uVar21);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar6) {
            pvVar17 = pMVar7->data;
            sVar9 = pMVar7->elemsize;
            pvVar22 = pMVar7[1].data;
            sVar10 = pMVar7[1].elemsize;
            sVar11 = this_00->elemsize;
            sVar12 = pMVar7[1].cstep;
            sVar13 = pMVar7->cstep;
            uVar24 = 0;
            do {
              if (0 < (int)uVar16) {
                uVar19 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar19 * 4) =
                       *(float *)((long)pvVar17 + uVar19 * 4) /
                       *(float *)((long)pvVar22 + uVar19 * 4);
                  uVar19 = uVar19 + 1;
                } while (uVar16 != uVar19);
              }
              uVar24 = uVar24 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
              pvVar22 = (void *)((long)pvVar22 + sVar10 * sVar12);
              pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar13);
            } while (uVar24 != uVar21);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 2) {
          if (0 < (int)uVar6) {
            pvVar17 = pMVar7->data;
            sVar9 = pMVar7->elemsize;
            pvVar22 = pMVar7[1].data;
            iVar5 = pMVar7[1].w;
            sVar10 = pMVar7[1].elemsize;
            sVar11 = this_00->elemsize;
            lVar23 = (long)(int)uVar1 * 4;
            sVar12 = pMVar7->cstep;
            uVar24 = 0;
            do {
              if (0 < (int)uVar14) {
                uVar26 = 0;
                pvVar18 = pvVar17;
                pvVar25 = pvVar15;
                do {
                  if (0 < (int)uVar1) {
                    fVar28 = *(float *)((long)pvVar22 + uVar26 * 4 + (long)iVar5 * sVar10 * uVar24);
                    uVar20 = 0;
                    do {
                      *(float *)((long)pvVar25 + uVar20 * 4) =
                           *(float *)((long)pvVar18 + uVar20 * 4) * (1.0 / fVar28);
                      uVar20 = uVar20 + 1;
                    } while (uVar19 != uVar20);
                  }
                  uVar26 = uVar26 + 1;
                  pvVar25 = (void *)((long)pvVar25 + lVar23);
                  pvVar18 = (void *)((long)pvVar18 + lVar23);
                } while (uVar26 != uVar14);
              }
              uVar24 = uVar24 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
              pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar12);
            } while (uVar24 != uVar21);
            return 0;
          }
          return 0;
        }
      }
    }
    break;
  case 4:
    uVar1 = pMVar7->w;
    uVar19 = (ulong)uVar1;
    sVar8 = pMVar7->elemsize;
    uVar2 = pMVar7[1].w;
    uVar24 = (ulong)uVar2;
    uVar3 = pMVar7[1].h;
    uVar4 = pMVar7[1].c;
    uVar21 = (ulong)uVar4;
    iVar5 = pMVar7->dims;
    if (iVar5 == 1) {
      uVar14 = uVar3 * uVar2;
      iVar5 = pMVar7[1].dims;
      if (uVar1 == 1) {
        if (iVar5 == 1) {
          Mat::create(this_00,uVar2,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          fVar28 = *pMVar7->data;
          pvVar17 = pMVar7[1].data;
          uVar21 = 0;
          do {
            fVar27 = *(float *)((long)pvVar17 + uVar21 * 4);
            if (fVar27 <= fVar28) {
              fVar27 = fVar28;
            }
            *(float *)((long)pvVar15 + uVar21 * 4) = fVar27;
            uVar21 = uVar21 + 1;
          } while (uVar24 != uVar21);
        }
        else if (iVar5 == 2) {
          Mat::create(this_00,uVar2,uVar3,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar14 < 1) {
            return 0;
          }
          fVar28 = *pMVar7->data;
          pvVar17 = pMVar7[1].data;
          uVar21 = 0;
          do {
            fVar27 = *(float *)((long)pvVar17 + uVar21 * 4);
            if (fVar27 <= fVar28) {
              fVar27 = fVar28;
            }
            *(float *)((long)pvVar15 + uVar21 * 4) = fVar27;
            uVar21 = uVar21 + 1;
          } while (uVar14 != uVar21);
        }
        else if (iVar5 == 3) {
          Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 != 0) {
            if (0 < (int)uVar4) {
              fVar28 = *pMVar7->data;
              pvVar17 = pMVar7[1].data;
              sVar9 = pMVar7[1].elemsize;
              sVar10 = this_00->elemsize;
              sVar11 = pMVar7[1].cstep;
              uVar24 = 0;
              do {
                if (0 < (int)uVar14) {
                  uVar19 = 0;
                  do {
                    fVar27 = *(float *)((long)pvVar17 + uVar19 * 4);
                    if (fVar27 <= fVar28) {
                      fVar27 = fVar28;
                    }
                    *(float *)((long)pvVar15 + uVar19 * 4) = fVar27;
                    uVar19 = uVar19 + 1;
                  } while (uVar14 != uVar19);
                }
                uVar24 = uVar24 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
                pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
              } while (uVar24 != uVar21);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else if (iVar5 == 1) {
        Mat::create(this_00,uVar1,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].w == 1) {
          if ((int)uVar1 < 1) {
            return 0;
          }
          fVar28 = *pMVar7[1].data;
          pvVar17 = pMVar7->data;
          uVar21 = 0;
          do {
            fVar27 = *(float *)((long)pvVar17 + uVar21 * 4);
            if (fVar27 <= fVar28) {
              fVar27 = fVar28;
            }
            *(float *)((long)pvVar15 + uVar21 * 4) = fVar27;
            uVar21 = uVar21 + 1;
          } while (uVar19 != uVar21);
        }
        else {
          if ((int)uVar1 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          pvVar22 = pMVar7[1].data;
          uVar21 = 0;
          do {
            fVar28 = *(float *)((long)pvVar22 + uVar21 * 4);
            fVar27 = *(float *)((long)pvVar17 + uVar21 * 4);
            if (fVar28 <= fVar27) {
              fVar28 = fVar27;
            }
            *(float *)((long)pvVar15 + uVar21 * 4) = fVar28;
            uVar21 = uVar21 + 1;
          } while (uVar19 != uVar21);
        }
      }
      else {
        if (iVar5 == 2) {
          Mat::create(this_00,uVar2,uVar3,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              pvVar17 = pMVar7->data;
              pvVar22 = pMVar7[1].data;
              lVar23 = (long)(int)uVar2 * 4;
              uVar21 = 0;
              do {
                if (0 < (int)uVar2) {
                  fVar28 = *(float *)((long)pvVar17 + uVar21 * 4);
                  uVar19 = 0;
                  do {
                    fVar27 = *(float *)((long)pvVar22 + uVar19 * 4);
                    if (fVar27 <= fVar28) {
                      fVar27 = fVar28;
                    }
                    *(float *)((long)pvVar15 + uVar19 * 4) = fVar27;
                    uVar19 = uVar19 + 1;
                  } while (uVar24 != uVar19);
                }
                uVar21 = uVar21 + 1;
                pvVar15 = (void *)((long)pvVar15 + lVar23);
                pvVar22 = (void *)((long)pvVar22 + lVar23);
              } while (uVar21 != uVar3);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 == 3) {
          Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 != 0) {
            if (0 < (int)uVar4) {
              pvVar17 = pMVar7->data;
              pvVar22 = pMVar7[1].data;
              sVar9 = pMVar7[1].elemsize;
              sVar10 = this_00->elemsize;
              sVar11 = pMVar7[1].cstep;
              uVar24 = 0;
              do {
                if (0 < (int)uVar14) {
                  fVar28 = *(float *)((long)pvVar17 + uVar24 * 4);
                  uVar19 = 0;
                  do {
                    fVar27 = *(float *)((long)pvVar22 + uVar19 * 4);
                    if (fVar27 <= fVar28) {
                      fVar27 = fVar28;
                    }
                    *(float *)((long)pvVar15 + uVar19 * 4) = fVar27;
                    uVar19 = uVar19 + 1;
                  } while (uVar14 != uVar19);
                }
                uVar24 = uVar24 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
                pvVar22 = (void *)((long)pvVar22 + sVar9 * sVar11);
              } while (uVar24 != uVar21);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
    }
    else {
      uVar14 = pMVar7->h;
      uVar16 = uVar14 * uVar1;
      if (iVar5 == 2) {
        if (pMVar7[1].dims == 3) {
          Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 != 0) {
            if (0 < (int)uVar4) {
              pvVar17 = pMVar7->data;
              pvVar22 = pMVar7[1].data;
              iVar5 = pMVar7->w;
              sVar9 = pMVar7->elemsize;
              sVar10 = pMVar7[1].elemsize;
              sVar11 = this_00->elemsize;
              lVar23 = (long)(int)uVar2 * 4;
              sVar12 = pMVar7[1].cstep;
              uVar19 = 0;
              do {
                if (0 < (int)uVar3) {
                  uVar26 = 0;
                  pvVar18 = pvVar15;
                  pvVar25 = pvVar22;
                  do {
                    if (0 < (int)uVar2) {
                      fVar28 = *(float *)((long)pvVar17 + uVar26 * 4 + (long)iVar5 * sVar9 * uVar19)
                      ;
                      uVar20 = 0;
                      do {
                        fVar27 = *(float *)((long)pvVar25 + uVar20 * 4);
                        if (fVar27 <= fVar28) {
                          fVar27 = fVar28;
                        }
                        *(float *)((long)pvVar18 + uVar20 * 4) = fVar27;
                        uVar20 = uVar20 + 1;
                      } while (uVar24 != uVar20);
                    }
                    uVar26 = uVar26 + 1;
                    pvVar18 = (void *)((long)pvVar18 + lVar23);
                    pvVar25 = (void *)((long)pvVar25 + lVar23);
                  } while (uVar26 != uVar3);
                }
                uVar19 = uVar19 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
                pvVar22 = (void *)((long)pvVar22 + sVar10 * sVar12);
              } while (uVar19 != uVar21);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(this_00,uVar1,uVar14,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].dims == 1) {
          Mat::create(this_00,uVar1,uVar14,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (pMVar7[1].w != 1) {
            if (0 < (int)uVar14) {
              pvVar17 = pMVar7->data;
              pvVar22 = pMVar7[1].data;
              lVar23 = (long)(int)uVar1 * 4;
              uVar21 = 0;
              do {
                if (0 < (int)uVar1) {
                  fVar28 = *(float *)((long)pvVar22 + uVar21 * 4);
                  uVar24 = 0;
                  do {
                    fVar27 = *(float *)((long)pvVar17 + uVar24 * 4);
                    if (fVar27 <= fVar28) {
                      fVar27 = fVar28;
                    }
                    *(float *)((long)pvVar15 + uVar24 * 4) = fVar27;
                    uVar24 = uVar24 + 1;
                  } while (uVar19 != uVar24);
                }
                uVar21 = uVar21 + 1;
                pvVar15 = (void *)((long)pvVar15 + lVar23);
                pvVar17 = (void *)((long)pvVar17 + lVar23);
              } while (uVar21 != uVar14);
              return 0;
            }
            return 0;
          }
          if ((int)uVar16 < 1) {
            return 0;
          }
          fVar28 = *pMVar7[1].data;
          pvVar17 = pMVar7->data;
          uVar21 = 0;
          do {
            fVar27 = *(float *)((long)pvVar17 + uVar21 * 4);
            if (fVar27 <= fVar28) {
              fVar27 = fVar28;
            }
            *(float *)((long)pvVar15 + uVar21 * 4) = fVar27;
            uVar21 = uVar21 + 1;
          } while (uVar16 != uVar21);
        }
        else if (pMVar7[1].dims == 2) {
          if ((int)uVar16 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          pvVar22 = pMVar7[1].data;
          uVar21 = 0;
          do {
            fVar28 = *(float *)((long)pvVar22 + uVar21 * 4);
            fVar27 = *(float *)((long)pvVar17 + uVar21 * 4);
            if (fVar28 <= fVar27) {
              fVar28 = fVar27;
            }
            *(float *)((long)pvVar15 + uVar21 * 4) = fVar28;
            uVar21 = uVar21 + 1;
          } while (uVar16 != uVar21);
        }
      }
      else if (iVar5 == 3) {
        uVar6 = pMVar7->c;
        uVar21 = (ulong)uVar6;
        Mat::create(this_00,uVar1,uVar14,uVar6,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        iVar5 = pMVar7[1].dims;
        if (iVar5 == 1) {
          if (pMVar7[1].w != 1) {
            if (0 < (int)uVar6) {
              pvVar17 = pMVar7->data;
              sVar9 = pMVar7->elemsize;
              pvVar22 = pMVar7[1].data;
              sVar10 = this_00->elemsize;
              sVar11 = pMVar7->cstep;
              uVar24 = 0;
              do {
                if (0 < (int)uVar16) {
                  fVar28 = *(float *)((long)pvVar22 + uVar24 * 4);
                  uVar19 = 0;
                  do {
                    fVar27 = *(float *)((long)pvVar17 + uVar19 * 4);
                    if (fVar27 <= fVar28) {
                      fVar27 = fVar28;
                    }
                    *(float *)((long)pvVar15 + uVar19 * 4) = fVar27;
                    uVar19 = uVar19 + 1;
                  } while (uVar16 != uVar19);
                }
                uVar24 = uVar24 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
                pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
              } while (uVar24 != uVar21);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar6) {
            fVar28 = *pMVar7[1].data;
            pvVar17 = pMVar7->data;
            sVar9 = pMVar7->elemsize;
            sVar10 = this_00->elemsize;
            sVar11 = pMVar7->cstep;
            uVar24 = 0;
            do {
              if (0 < (int)uVar16) {
                uVar19 = 0;
                do {
                  fVar27 = *(float *)((long)pvVar17 + uVar19 * 4);
                  if (fVar27 <= fVar28) {
                    fVar27 = fVar28;
                  }
                  *(float *)((long)pvVar15 + uVar19 * 4) = fVar27;
                  uVar19 = uVar19 + 1;
                } while (uVar16 != uVar19);
              }
              uVar24 = uVar24 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
              pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
            } while (uVar24 != uVar21);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 3) {
          if (((uVar2 == 1) && (uVar3 == 1)) && (uVar4 == uVar6)) {
            if (0 < (int)uVar6) {
              pvVar17 = pMVar7->data;
              sVar9 = pMVar7->elemsize;
              pvVar22 = pMVar7[1].data;
              sVar10 = pMVar7[1].elemsize;
              sVar11 = pMVar7[1].cstep;
              sVar12 = this_00->elemsize;
              sVar13 = pMVar7->cstep;
              uVar24 = 0;
              do {
                if (0 < (int)uVar16) {
                  uVar19 = 0;
                  do {
                    fVar28 = *(float *)((long)pvVar22 + sVar10 * sVar11 * uVar24);
                    fVar27 = *(float *)((long)pvVar17 + uVar19 * 4);
                    if (fVar28 <= fVar27) {
                      fVar28 = fVar27;
                    }
                    *(float *)((long)pvVar15 + uVar19 * 4) = fVar28;
                    uVar19 = uVar19 + 1;
                  } while (uVar16 != uVar19);
                }
                uVar24 = uVar24 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
                pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar13);
              } while (uVar24 != uVar21);
              return 0;
            }
            return 0;
          }
          if ((uVar2 == uVar1) && (uVar4 == 1 && uVar14 == uVar3)) {
            if (0 < (int)uVar6) {
              pvVar17 = pMVar7->data;
              sVar9 = pMVar7->elemsize;
              pvVar22 = pMVar7[1].data;
              sVar10 = this_00->elemsize;
              sVar11 = pMVar7->cstep;
              uVar24 = 0;
              do {
                if (0 < (int)uVar16) {
                  uVar19 = 0;
                  do {
                    fVar28 = *(float *)((long)pvVar22 + uVar19 * 4);
                    fVar27 = *(float *)((long)pvVar17 + uVar19 * 4);
                    if (fVar28 <= fVar27) {
                      fVar28 = fVar27;
                    }
                    *(float *)((long)pvVar15 + uVar19 * 4) = fVar28;
                    uVar19 = uVar19 + 1;
                  } while (uVar16 != uVar19);
                }
                uVar24 = uVar24 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
                pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
              } while (uVar24 != uVar21);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar6) {
            pvVar17 = pMVar7->data;
            sVar9 = pMVar7->elemsize;
            pvVar22 = pMVar7[1].data;
            sVar10 = pMVar7[1].elemsize;
            sVar11 = this_00->elemsize;
            sVar12 = pMVar7[1].cstep;
            sVar13 = pMVar7->cstep;
            uVar24 = 0;
            do {
              if (0 < (int)uVar16) {
                uVar19 = 0;
                do {
                  fVar28 = *(float *)((long)pvVar22 + uVar19 * 4);
                  fVar27 = *(float *)((long)pvVar17 + uVar19 * 4);
                  if (fVar28 <= fVar27) {
                    fVar28 = fVar27;
                  }
                  *(float *)((long)pvVar15 + uVar19 * 4) = fVar28;
                  uVar19 = uVar19 + 1;
                } while (uVar16 != uVar19);
              }
              uVar24 = uVar24 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
              pvVar22 = (void *)((long)pvVar22 + sVar10 * sVar12);
              pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar13);
            } while (uVar24 != uVar21);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 2) {
          if (0 < (int)uVar6) {
            pvVar17 = pMVar7->data;
            sVar9 = pMVar7->elemsize;
            iVar5 = pMVar7[1].w;
            sVar10 = pMVar7[1].elemsize;
            pvVar22 = pMVar7[1].data;
            sVar11 = this_00->elemsize;
            lVar23 = (long)(int)uVar1 * 4;
            sVar12 = pMVar7->cstep;
            uVar24 = 0;
            do {
              if (0 < (int)uVar14) {
                uVar26 = 0;
                pvVar18 = pvVar17;
                pvVar25 = pvVar15;
                do {
                  if (0 < (int)uVar1) {
                    fVar28 = *(float *)((long)pvVar22 + uVar26 * 4 + (long)iVar5 * sVar10 * uVar24);
                    uVar20 = 0;
                    do {
                      fVar27 = *(float *)((long)pvVar18 + uVar20 * 4);
                      if (fVar27 <= fVar28) {
                        fVar27 = fVar28;
                      }
                      *(float *)((long)pvVar25 + uVar20 * 4) = fVar27;
                      uVar20 = uVar20 + 1;
                    } while (uVar19 != uVar20);
                  }
                  uVar26 = uVar26 + 1;
                  pvVar25 = (void *)((long)pvVar25 + lVar23);
                  pvVar18 = (void *)((long)pvVar18 + lVar23);
                } while (uVar26 != uVar14);
              }
              uVar24 = uVar24 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
              pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar12);
            } while (uVar24 != uVar21);
            return 0;
          }
          return 0;
        }
      }
    }
    break;
  case 5:
    uVar1 = pMVar7->w;
    uVar19 = (ulong)uVar1;
    sVar8 = pMVar7->elemsize;
    uVar2 = pMVar7[1].w;
    uVar24 = (ulong)uVar2;
    uVar3 = pMVar7[1].h;
    uVar4 = pMVar7[1].c;
    uVar21 = (ulong)uVar4;
    iVar5 = pMVar7->dims;
    if (iVar5 == 1) {
      uVar14 = uVar3 * uVar2;
      iVar5 = pMVar7[1].dims;
      if (uVar1 == 1) {
        if (iVar5 == 1) {
          Mat::create(this_00,uVar2,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          fVar28 = *pMVar7->data;
          pvVar17 = pMVar7[1].data;
          uVar21 = 0;
          do {
            fVar27 = *(float *)((long)pvVar17 + uVar21 * 4);
            if (fVar28 <= fVar27) {
              fVar27 = fVar28;
            }
            *(float *)((long)pvVar15 + uVar21 * 4) = fVar27;
            uVar21 = uVar21 + 1;
          } while (uVar24 != uVar21);
        }
        else if (iVar5 == 2) {
          Mat::create(this_00,uVar2,uVar3,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)uVar14 < 1) {
            return 0;
          }
          fVar28 = *pMVar7->data;
          pvVar17 = pMVar7[1].data;
          uVar21 = 0;
          do {
            fVar27 = *(float *)((long)pvVar17 + uVar21 * 4);
            if (fVar28 <= fVar27) {
              fVar27 = fVar28;
            }
            *(float *)((long)pvVar15 + uVar21 * 4) = fVar27;
            uVar21 = uVar21 + 1;
          } while (uVar14 != uVar21);
        }
        else if (iVar5 == 3) {
          Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 != 0) {
            if (0 < (int)uVar4) {
              fVar28 = *pMVar7->data;
              pvVar17 = pMVar7[1].data;
              sVar9 = pMVar7[1].elemsize;
              sVar10 = this_00->elemsize;
              sVar11 = pMVar7[1].cstep;
              uVar24 = 0;
              do {
                if (0 < (int)uVar14) {
                  uVar19 = 0;
                  do {
                    fVar27 = *(float *)((long)pvVar17 + uVar19 * 4);
                    if (fVar28 <= fVar27) {
                      fVar27 = fVar28;
                    }
                    *(float *)((long)pvVar15 + uVar19 * 4) = fVar27;
                    uVar19 = uVar19 + 1;
                  } while (uVar14 != uVar19);
                }
                uVar24 = uVar24 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
                pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
              } while (uVar24 != uVar21);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
      else if (iVar5 == 1) {
        Mat::create(this_00,uVar1,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].w == 1) {
          if ((int)uVar1 < 1) {
            return 0;
          }
          fVar28 = *pMVar7[1].data;
          pvVar17 = pMVar7->data;
          uVar21 = 0;
          do {
            fVar27 = *(float *)((long)pvVar17 + uVar21 * 4);
            if (fVar28 <= fVar27) {
              fVar27 = fVar28;
            }
            *(float *)((long)pvVar15 + uVar21 * 4) = fVar27;
            uVar21 = uVar21 + 1;
          } while (uVar19 != uVar21);
        }
        else {
          if ((int)uVar1 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          pvVar22 = pMVar7[1].data;
          uVar21 = 0;
          do {
            fVar28 = *(float *)((long)pvVar22 + uVar21 * 4);
            fVar27 = *(float *)((long)pvVar17 + uVar21 * 4);
            if (fVar27 <= fVar28) {
              fVar28 = fVar27;
            }
            *(float *)((long)pvVar15 + uVar21 * 4) = fVar28;
            uVar21 = uVar21 + 1;
          } while (uVar19 != uVar21);
        }
      }
      else {
        if (iVar5 == 2) {
          Mat::create(this_00,uVar2,uVar3,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              pvVar17 = pMVar7->data;
              pvVar22 = pMVar7[1].data;
              lVar23 = (long)(int)uVar2 * 4;
              uVar21 = 0;
              do {
                if (0 < (int)uVar2) {
                  fVar28 = *(float *)((long)pvVar17 + uVar21 * 4);
                  uVar19 = 0;
                  do {
                    fVar27 = *(float *)((long)pvVar22 + uVar19 * 4);
                    if (fVar28 <= fVar27) {
                      fVar27 = fVar28;
                    }
                    *(float *)((long)pvVar15 + uVar19 * 4) = fVar27;
                    uVar19 = uVar19 + 1;
                  } while (uVar24 != uVar19);
                }
                uVar21 = uVar21 + 1;
                pvVar15 = (void *)((long)pvVar15 + lVar23);
                pvVar22 = (void *)((long)pvVar22 + lVar23);
              } while (uVar21 != uVar3);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 == 3) {
          Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 != 0) {
            if (0 < (int)uVar4) {
              pvVar17 = pMVar7->data;
              pvVar22 = pMVar7[1].data;
              sVar9 = pMVar7[1].elemsize;
              sVar10 = this_00->elemsize;
              sVar11 = pMVar7[1].cstep;
              uVar24 = 0;
              do {
                if (0 < (int)uVar14) {
                  fVar28 = *(float *)((long)pvVar17 + uVar24 * 4);
                  uVar19 = 0;
                  do {
                    fVar27 = *(float *)((long)pvVar22 + uVar19 * 4);
                    if (fVar28 <= fVar27) {
                      fVar27 = fVar28;
                    }
                    *(float *)((long)pvVar15 + uVar19 * 4) = fVar27;
                    uVar19 = uVar19 + 1;
                  } while (uVar14 != uVar19);
                }
                uVar24 = uVar24 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
                pvVar22 = (void *)((long)pvVar22 + sVar9 * sVar11);
              } while (uVar24 != uVar21);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
    }
    else {
      uVar14 = pMVar7->h;
      uVar16 = uVar14 * uVar1;
      if (iVar5 == 2) {
        if (pMVar7[1].dims == 3) {
          Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 != 0) {
            if (0 < (int)uVar4) {
              pvVar17 = pMVar7->data;
              pvVar22 = pMVar7[1].data;
              iVar5 = pMVar7->w;
              sVar9 = pMVar7->elemsize;
              sVar10 = pMVar7[1].elemsize;
              sVar11 = this_00->elemsize;
              lVar23 = (long)(int)uVar2 * 4;
              sVar12 = pMVar7[1].cstep;
              uVar19 = 0;
              do {
                if (0 < (int)uVar3) {
                  uVar26 = 0;
                  pvVar18 = pvVar15;
                  pvVar25 = pvVar22;
                  do {
                    if (0 < (int)uVar2) {
                      fVar28 = *(float *)((long)pvVar17 + uVar26 * 4 + (long)iVar5 * sVar9 * uVar19)
                      ;
                      uVar20 = 0;
                      do {
                        fVar27 = *(float *)((long)pvVar25 + uVar20 * 4);
                        if (fVar28 <= fVar27) {
                          fVar27 = fVar28;
                        }
                        *(float *)((long)pvVar18 + uVar20 * 4) = fVar27;
                        uVar20 = uVar20 + 1;
                      } while (uVar24 != uVar20);
                    }
                    uVar26 = uVar26 + 1;
                    pvVar18 = (void *)((long)pvVar18 + lVar23);
                    pvVar25 = (void *)((long)pvVar25 + lVar23);
                  } while (uVar26 != uVar3);
                }
                uVar19 = uVar19 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
                pvVar22 = (void *)((long)pvVar22 + sVar10 * sVar12);
              } while (uVar19 != uVar21);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(this_00,uVar1,uVar14,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].dims == 1) {
          Mat::create(this_00,uVar1,uVar14,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (pMVar7[1].w != 1) {
            if (0 < (int)uVar14) {
              pvVar17 = pMVar7->data;
              pvVar22 = pMVar7[1].data;
              lVar23 = (long)(int)uVar1 * 4;
              uVar21 = 0;
              do {
                if (0 < (int)uVar1) {
                  fVar28 = *(float *)((long)pvVar22 + uVar21 * 4);
                  uVar24 = 0;
                  do {
                    fVar27 = *(float *)((long)pvVar17 + uVar24 * 4);
                    if (fVar28 <= fVar27) {
                      fVar27 = fVar28;
                    }
                    *(float *)((long)pvVar15 + uVar24 * 4) = fVar27;
                    uVar24 = uVar24 + 1;
                  } while (uVar19 != uVar24);
                }
                uVar21 = uVar21 + 1;
                pvVar15 = (void *)((long)pvVar15 + lVar23);
                pvVar17 = (void *)((long)pvVar17 + lVar23);
              } while (uVar21 != uVar14);
              return 0;
            }
            return 0;
          }
          if ((int)uVar16 < 1) {
            return 0;
          }
          fVar28 = *pMVar7[1].data;
          pvVar17 = pMVar7->data;
          uVar21 = 0;
          do {
            fVar27 = *(float *)((long)pvVar17 + uVar21 * 4);
            if (fVar28 <= fVar27) {
              fVar27 = fVar28;
            }
            *(float *)((long)pvVar15 + uVar21 * 4) = fVar27;
            uVar21 = uVar21 + 1;
          } while (uVar16 != uVar21);
        }
        else if (pMVar7[1].dims == 2) {
          if ((int)uVar16 < 1) {
            return 0;
          }
          pvVar17 = pMVar7->data;
          pvVar22 = pMVar7[1].data;
          uVar21 = 0;
          do {
            fVar28 = *(float *)((long)pvVar22 + uVar21 * 4);
            fVar27 = *(float *)((long)pvVar17 + uVar21 * 4);
            if (fVar27 <= fVar28) {
              fVar28 = fVar27;
            }
            *(float *)((long)pvVar15 + uVar21 * 4) = fVar28;
            uVar21 = uVar21 + 1;
          } while (uVar16 != uVar21);
        }
      }
      else if (iVar5 == 3) {
        uVar6 = pMVar7->c;
        uVar21 = (ulong)uVar6;
        Mat::create(this_00,uVar1,uVar14,uVar6,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        iVar5 = pMVar7[1].dims;
        if (iVar5 == 1) {
          if (pMVar7[1].w != 1) {
            if (0 < (int)uVar6) {
              pvVar17 = pMVar7->data;
              sVar9 = pMVar7->elemsize;
              pvVar22 = pMVar7[1].data;
              sVar10 = this_00->elemsize;
              sVar11 = pMVar7->cstep;
              uVar24 = 0;
              do {
                if (0 < (int)uVar16) {
                  fVar28 = *(float *)((long)pvVar22 + uVar24 * 4);
                  uVar19 = 0;
                  do {
                    fVar27 = *(float *)((long)pvVar17 + uVar19 * 4);
                    if (fVar28 <= fVar27) {
                      fVar27 = fVar28;
                    }
                    *(float *)((long)pvVar15 + uVar19 * 4) = fVar27;
                    uVar19 = uVar19 + 1;
                  } while (uVar16 != uVar19);
                }
                uVar24 = uVar24 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
                pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
              } while (uVar24 != uVar21);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar6) {
            fVar28 = *pMVar7[1].data;
            pvVar17 = pMVar7->data;
            sVar9 = pMVar7->elemsize;
            sVar10 = this_00->elemsize;
            sVar11 = pMVar7->cstep;
            uVar24 = 0;
            do {
              if (0 < (int)uVar16) {
                uVar19 = 0;
                do {
                  fVar27 = *(float *)((long)pvVar17 + uVar19 * 4);
                  if (fVar28 <= fVar27) {
                    fVar27 = fVar28;
                  }
                  *(float *)((long)pvVar15 + uVar19 * 4) = fVar27;
                  uVar19 = uVar19 + 1;
                } while (uVar16 != uVar19);
              }
              uVar24 = uVar24 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
              pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
            } while (uVar24 != uVar21);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 3) {
          if (((uVar2 == 1) && (uVar3 == 1)) && (uVar4 == uVar6)) {
            if (0 < (int)uVar6) {
              pvVar17 = pMVar7->data;
              sVar9 = pMVar7->elemsize;
              pvVar22 = pMVar7[1].data;
              sVar10 = pMVar7[1].elemsize;
              sVar11 = pMVar7[1].cstep;
              sVar12 = this_00->elemsize;
              sVar13 = pMVar7->cstep;
              uVar24 = 0;
              do {
                if (0 < (int)uVar16) {
                  uVar19 = 0;
                  do {
                    fVar28 = *(float *)((long)pvVar22 + sVar10 * sVar11 * uVar24);
                    fVar27 = *(float *)((long)pvVar17 + uVar19 * 4);
                    if (fVar27 <= fVar28) {
                      fVar28 = fVar27;
                    }
                    *(float *)((long)pvVar15 + uVar19 * 4) = fVar28;
                    uVar19 = uVar19 + 1;
                  } while (uVar16 != uVar19);
                }
                uVar24 = uVar24 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
                pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar13);
              } while (uVar24 != uVar21);
              return 0;
            }
            return 0;
          }
          if ((uVar2 == uVar1) && (uVar4 == 1 && uVar14 == uVar3)) {
            if (0 < (int)uVar6) {
              pvVar17 = pMVar7->data;
              sVar9 = pMVar7->elemsize;
              pvVar22 = pMVar7[1].data;
              sVar10 = this_00->elemsize;
              sVar11 = pMVar7->cstep;
              uVar24 = 0;
              do {
                if (0 < (int)uVar16) {
                  uVar19 = 0;
                  do {
                    fVar28 = *(float *)((long)pvVar22 + uVar19 * 4);
                    fVar27 = *(float *)((long)pvVar17 + uVar19 * 4);
                    if (fVar27 <= fVar28) {
                      fVar28 = fVar27;
                    }
                    *(float *)((long)pvVar15 + uVar19 * 4) = fVar28;
                    uVar19 = uVar19 + 1;
                  } while (uVar16 != uVar19);
                }
                uVar24 = uVar24 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
                pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
              } while (uVar24 != uVar21);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar6) {
            pvVar17 = pMVar7->data;
            sVar9 = pMVar7->elemsize;
            pvVar22 = pMVar7[1].data;
            sVar10 = pMVar7[1].elemsize;
            sVar11 = this_00->elemsize;
            sVar12 = pMVar7[1].cstep;
            sVar13 = pMVar7->cstep;
            uVar24 = 0;
            do {
              if (0 < (int)uVar16) {
                uVar19 = 0;
                do {
                  fVar28 = *(float *)((long)pvVar22 + uVar19 * 4);
                  fVar27 = *(float *)((long)pvVar17 + uVar19 * 4);
                  if (fVar27 <= fVar28) {
                    fVar28 = fVar27;
                  }
                  *(float *)((long)pvVar15 + uVar19 * 4) = fVar28;
                  uVar19 = uVar19 + 1;
                } while (uVar16 != uVar19);
              }
              uVar24 = uVar24 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
              pvVar22 = (void *)((long)pvVar22 + sVar10 * sVar12);
              pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar13);
            } while (uVar24 != uVar21);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 2) {
          if (0 < (int)uVar6) {
            pvVar17 = pMVar7->data;
            sVar9 = pMVar7->elemsize;
            iVar5 = pMVar7[1].w;
            sVar10 = pMVar7[1].elemsize;
            pvVar22 = pMVar7[1].data;
            sVar11 = this_00->elemsize;
            lVar23 = (long)(int)uVar1 * 4;
            sVar12 = pMVar7->cstep;
            uVar24 = 0;
            do {
              if (0 < (int)uVar14) {
                uVar26 = 0;
                pvVar18 = pvVar17;
                pvVar25 = pvVar15;
                do {
                  if (0 < (int)uVar1) {
                    fVar28 = *(float *)((long)pvVar22 + uVar26 * 4 + (long)iVar5 * sVar10 * uVar24);
                    uVar20 = 0;
                    do {
                      fVar27 = *(float *)((long)pvVar18 + uVar20 * 4);
                      if (fVar28 <= fVar27) {
                        fVar27 = fVar28;
                      }
                      *(float *)((long)pvVar25 + uVar20 * 4) = fVar27;
                      uVar20 = uVar20 + 1;
                    } while (uVar19 != uVar20);
                  }
                  uVar26 = uVar26 + 1;
                  pvVar25 = (void *)((long)pvVar25 + lVar23);
                  pvVar18 = (void *)((long)pvVar18 + lVar23);
                } while (uVar26 != uVar14);
              }
              uVar24 = uVar24 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
              pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar12);
            } while (uVar24 != uVar21);
            return 0;
          }
          return 0;
        }
      }
    }
    break;
  case 6:
    uVar1 = pMVar7->w;
    uVar19 = (ulong)uVar1;
    sVar8 = pMVar7->elemsize;
    uVar2 = pMVar7[1].w;
    uVar24 = (ulong)uVar2;
    uVar3 = pMVar7[1].h;
    uVar4 = pMVar7[1].c;
    uVar21 = (ulong)uVar4;
    iVar5 = pMVar7->dims;
    if (iVar5 == 1) {
      uVar14 = uVar3 * uVar2;
      iVar5 = pMVar7[1].dims;
      if (uVar1 == 1) {
        if (iVar5 == 1) {
          Mat::create(this_00,uVar2,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar2) {
              fVar28 = *pMVar7->data;
              pvVar17 = pMVar7[1].data;
              uVar21 = 0;
              do {
                fVar27 = powf(fVar28,*(float *)((long)pvVar17 + uVar21 * 4));
                *(float *)((long)pvVar15 + uVar21 * 4) = fVar27;
                uVar21 = uVar21 + 1;
              } while (uVar24 != uVar21);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 == 2) {
          Mat::create(this_00,uVar2,uVar3,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar14) {
              fVar28 = *pMVar7->data;
              pvVar17 = pMVar7[1].data;
              uVar21 = 0;
              do {
                fVar27 = powf(fVar28,*(float *)((long)pvVar17 + uVar21 * 4));
                *(float *)((long)pvVar15 + uVar21 * 4) = fVar27;
                uVar21 = uVar21 + 1;
              } while (uVar14 != uVar21);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if (0 < (int)uVar4) {
          fVar28 = *pMVar7->data;
          pvVar17 = pMVar7[1].data;
          sVar9 = pMVar7[1].elemsize;
          sVar10 = this_00->elemsize;
          sVar11 = pMVar7[1].cstep;
          uVar24 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar19 = 0;
              do {
                fVar27 = powf(fVar28,*(float *)((long)pvVar17 + uVar19 * 4));
                *(float *)((long)pvVar15 + uVar19 * 4) = fVar27;
                uVar19 = uVar19 + 1;
              } while (uVar14 != uVar19);
            }
            uVar24 = uVar24 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
            pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
          } while (uVar24 != uVar21);
          return 0;
        }
        return 0;
      }
      if (iVar5 == 1) {
        Mat::create(this_00,uVar1,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (pMVar7[1].w != 1) {
          if (0 < (int)uVar1) {
            pvVar17 = pMVar7->data;
            pvVar22 = pMVar7[1].data;
            uVar21 = 0;
            do {
              fVar28 = powf(*(float *)((long)pvVar17 + uVar21 * 4),
                            *(float *)((long)pvVar22 + uVar21 * 4));
              *(float *)((long)pvVar15 + uVar21 * 4) = fVar28;
              uVar21 = uVar21 + 1;
            } while (uVar19 != uVar21);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar1) {
          fVar28 = *pMVar7[1].data;
          pvVar17 = pMVar7->data;
          uVar21 = 0;
          do {
            fVar27 = powf(*(float *)((long)pvVar17 + uVar21 * 4),fVar28);
            *(float *)((long)pvVar15 + uVar21 * 4) = fVar27;
            uVar21 = uVar21 + 1;
          } while (uVar19 != uVar21);
          return 0;
        }
        return 0;
      }
      if (iVar5 == 2) {
        Mat::create(this_00,uVar2,uVar3,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if (0 < (int)uVar3) {
            pvVar17 = pMVar7->data;
            pvVar22 = pMVar7[1].data;
            lVar23 = (long)(int)uVar2 * 4;
            uVar21 = 0;
            do {
              if (0 < (int)uVar2) {
                fVar28 = *(float *)((long)pvVar17 + uVar21 * 4);
                uVar19 = 0;
                do {
                  fVar27 = powf(fVar28,*(float *)((long)pvVar22 + uVar19 * 4));
                  *(float *)((long)pvVar15 + uVar19 * 4) = fVar27;
                  uVar19 = uVar19 + 1;
                } while (uVar24 != uVar19);
              }
              uVar21 = uVar21 + 1;
              pvVar15 = (void *)((long)pvVar15 + lVar23);
              pvVar22 = (void *)((long)pvVar22 + lVar23);
            } while (uVar21 != uVar3);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar5 != 3) {
        return 0;
      }
      Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      sVar8 = this_00->cstep;
      if ((long)this_00->c * sVar8 == 0) {
        return -100;
      }
      if (0 < (int)uVar4) {
        pvVar17 = pMVar7->data;
        pvVar22 = pMVar7[1].data;
        sVar9 = pMVar7[1].elemsize;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar7[1].cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar14) {
            fVar28 = *(float *)((long)pvVar17 + uVar24 * 4);
            uVar19 = 0;
            do {
              fVar27 = powf(fVar28,*(float *)((long)pvVar22 + uVar19 * 4));
              *(float *)((long)pvVar15 + uVar19 * 4) = fVar27;
              uVar19 = uVar19 + 1;
            } while (uVar14 != uVar19);
          }
          uVar24 = uVar24 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
          pvVar22 = (void *)((long)pvVar22 + sVar9 * sVar11);
        } while (uVar24 != uVar21);
        return 0;
      }
      return 0;
    }
    uVar14 = pMVar7->h;
    uVar16 = uVar14 * uVar1;
    if (iVar5 != 2) {
      if (iVar5 != 3) {
        return 0;
      }
      uVar6 = pMVar7->c;
      uVar21 = (ulong)uVar6;
      Mat::create(this_00,uVar1,uVar14,uVar6,sVar8,opt->blob_allocator);
      local_58 = this_00->data;
      if (local_58 == (void *)0x0) {
        return -100;
      }
      sVar8 = this_00->cstep;
      if ((long)this_00->c * sVar8 == 0) {
        return -100;
      }
      iVar5 = pMVar7[1].dims;
      if (iVar5 != 1) {
        if (iVar5 == 3) {
          if (((uVar2 == 1) && (uVar3 == 1)) && (uVar4 == uVar6)) {
            if (0 < (int)uVar6) {
              pvVar15 = pMVar7->data;
              sVar9 = pMVar7->elemsize;
              pvVar17 = pMVar7[1].data;
              sVar10 = pMVar7[1].elemsize;
              sVar11 = pMVar7[1].cstep;
              sVar12 = this_00->elemsize;
              sVar13 = pMVar7->cstep;
              local_90 = 0;
              do {
                if (0 < (int)uVar16) {
                  uVar24 = 0;
                  do {
                    fVar28 = powf(*(float *)((long)pvVar15 + uVar24 * 4),
                                  *(float *)((long)pvVar17 + sVar10 * sVar11 * local_90));
                    *(float *)((long)local_58 + uVar24 * 4) = fVar28;
                    uVar24 = uVar24 + 1;
                  } while (uVar16 != uVar24);
                }
                local_90 = local_90 + 1;
                local_58 = (void *)((long)local_58 + sVar8 * sVar12);
                pvVar15 = (void *)((long)pvVar15 + sVar9 * sVar13);
              } while (local_90 != uVar21);
              return 0;
            }
            return 0;
          }
          if ((uVar2 == uVar1) && (uVar4 == 1 && uVar14 == uVar3)) {
            if (0 < (int)uVar6) {
              pvVar15 = pMVar7->data;
              sVar9 = pMVar7->elemsize;
              pvVar17 = pMVar7[1].data;
              sVar10 = this_00->elemsize;
              sVar11 = pMVar7->cstep;
              uVar24 = 0;
              do {
                if (0 < (int)uVar16) {
                  uVar19 = 0;
                  do {
                    fVar28 = powf(*(float *)((long)pvVar15 + uVar19 * 4),
                                  *(float *)((long)pvVar17 + uVar19 * 4));
                    *(float *)((long)local_58 + uVar19 * 4) = fVar28;
                    uVar19 = uVar19 + 1;
                  } while (uVar16 != uVar19);
                }
                uVar24 = uVar24 + 1;
                local_58 = (void *)((long)local_58 + sVar8 * sVar10);
                pvVar15 = (void *)((long)pvVar15 + sVar9 * sVar11);
              } while (uVar24 != uVar21);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar6) {
            pvVar15 = pMVar7->data;
            sVar9 = pMVar7->elemsize;
            pvVar17 = pMVar7[1].data;
            sVar10 = pMVar7[1].elemsize;
            sVar11 = this_00->elemsize;
            sVar12 = pMVar7[1].cstep;
            sVar13 = pMVar7->cstep;
            uVar24 = 0;
            do {
              if (0 < (int)uVar16) {
                uVar19 = 0;
                do {
                  fVar28 = powf(*(float *)((long)pvVar15 + uVar19 * 4),
                                *(float *)((long)pvVar17 + uVar19 * 4));
                  *(float *)((long)local_58 + uVar19 * 4) = fVar28;
                  uVar19 = uVar19 + 1;
                } while (uVar16 != uVar19);
              }
              uVar24 = uVar24 + 1;
              local_58 = (void *)((long)local_58 + sVar8 * sVar11);
              pvVar17 = (void *)((long)pvVar17 + sVar10 * sVar12);
              pvVar15 = (void *)((long)pvVar15 + sVar9 * sVar13);
            } while (uVar24 != uVar21);
            return 0;
          }
          return 0;
        }
        if (iVar5 != 2) {
          return 0;
        }
        if (0 < (int)uVar6) {
          local_68 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          iVar5 = pMVar7[1].w;
          sVar10 = pMVar7[1].elemsize;
          pvVar15 = pMVar7[1].data;
          sVar11 = this_00->elemsize;
          lVar23 = (long)(int)uVar1 * 4;
          sVar12 = pMVar7->cstep;
          local_50 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar24 = 0;
              pvVar17 = local_58;
              pvVar22 = local_68;
              do {
                if (0 < (int)uVar1) {
                  fVar28 = *(float *)((long)pvVar15 + uVar24 * 4 + (long)iVar5 * sVar10 * local_50);
                  uVar26 = 0;
                  do {
                    fVar27 = powf(*(float *)((long)pvVar22 + uVar26 * 4),fVar28);
                    *(float *)((long)pvVar17 + uVar26 * 4) = fVar27;
                    uVar26 = uVar26 + 1;
                  } while (uVar19 != uVar26);
                }
                uVar24 = uVar24 + 1;
                pvVar17 = (void *)((long)pvVar17 + lVar23);
                pvVar22 = (void *)((long)pvVar22 + lVar23);
              } while (uVar24 != uVar14);
            }
            local_50 = local_50 + 1;
            local_58 = (void *)((long)local_58 + sVar8 * sVar11);
            local_68 = (void *)((long)local_68 + sVar9 * sVar12);
          } while (local_50 != uVar21);
          return 0;
        }
        return 0;
      }
      if (pMVar7[1].w != 1) {
        if (0 < (int)uVar6) {
          pvVar15 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          pvVar17 = pMVar7[1].data;
          sVar10 = this_00->elemsize;
          sVar11 = pMVar7->cstep;
          uVar24 = 0;
          do {
            if (0 < (int)uVar16) {
              fVar28 = *(float *)((long)pvVar17 + uVar24 * 4);
              uVar19 = 0;
              do {
                fVar27 = powf(*(float *)((long)pvVar15 + uVar19 * 4),fVar28);
                *(float *)((long)local_58 + uVar19 * 4) = fVar27;
                uVar19 = uVar19 + 1;
              } while (uVar16 != uVar19);
            }
            uVar24 = uVar24 + 1;
            local_58 = (void *)((long)local_58 + sVar8 * sVar10);
            pvVar15 = (void *)((long)pvVar15 + sVar9 * sVar11);
          } while (uVar24 != uVar21);
          return 0;
        }
        return 0;
      }
      if (0 < (int)uVar6) {
        fVar28 = *pMVar7[1].data;
        pvVar15 = pMVar7->data;
        sVar9 = pMVar7->elemsize;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar7->cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar16) {
            uVar19 = 0;
            do {
              fVar27 = powf(*(float *)((long)pvVar15 + uVar19 * 4),fVar28);
              *(float *)((long)local_58 + uVar19 * 4) = fVar27;
              uVar19 = uVar19 + 1;
            } while (uVar16 != uVar19);
          }
          uVar24 = uVar24 + 1;
          local_58 = (void *)((long)local_58 + sVar8 * sVar10);
          pvVar15 = (void *)((long)pvVar15 + sVar9 * sVar11);
        } while (uVar24 != uVar21);
        return 0;
      }
      return 0;
    }
    if (pMVar7[1].dims == 3) {
      Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
      local_60 = this_00->data;
      if (local_60 == (void *)0x0) {
        return -100;
      }
      sVar8 = this_00->cstep;
      if ((long)this_00->c * sVar8 != 0) {
        if (0 < (int)uVar4) {
          pvVar15 = pMVar7->data;
          local_68 = pMVar7[1].data;
          iVar5 = pMVar7->w;
          sVar9 = pMVar7->elemsize;
          sVar10 = pMVar7[1].elemsize;
          sVar11 = this_00->elemsize;
          lVar23 = (long)(int)uVar2 * 4;
          sVar12 = pMVar7[1].cstep;
          local_58 = (void *)0x0;
          do {
            if (0 < (int)uVar3) {
              uVar19 = 0;
              pvVar17 = local_60;
              pvVar22 = local_68;
              do {
                if (0 < (int)uVar2) {
                  fVar28 = *(float *)((long)pvVar15 +
                                     uVar19 * 4 + (long)iVar5 * sVar9 * (long)local_58);
                  uVar26 = 0;
                  do {
                    fVar27 = powf(fVar28,*(float *)((long)pvVar22 + uVar26 * 4));
                    *(float *)((long)pvVar17 + uVar26 * 4) = fVar27;
                    uVar26 = uVar26 + 1;
                  } while (uVar24 != uVar26);
                }
                uVar19 = uVar19 + 1;
                pvVar17 = (void *)((long)pvVar17 + lVar23);
                pvVar22 = (void *)((long)pvVar22 + lVar23);
              } while (uVar19 != uVar3);
            }
            local_58 = (void *)((long)local_58 + 1);
            local_60 = (void *)((long)local_60 + sVar8 * sVar11);
            local_68 = (void *)((long)local_68 + sVar10 * sVar12);
          } while (local_58 != (void *)uVar21);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    Mat::create(this_00,uVar1,uVar14,sVar8,opt->blob_allocator);
    pvVar15 = this_00->data;
    if (pvVar15 == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep == 0) {
      return -100;
    }
    if (pMVar7[1].dims == 1) {
      Mat::create(this_00,uVar1,uVar14,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar7[1].w != 1) {
        if (0 < (int)uVar14) {
          pvVar17 = pMVar7->data;
          pvVar22 = pMVar7[1].data;
          lVar23 = (long)(int)uVar1 * 4;
          uVar21 = 0;
          do {
            if (0 < (int)uVar1) {
              fVar28 = *(float *)((long)pvVar22 + uVar21 * 4);
              uVar24 = 0;
              do {
                fVar27 = powf(*(float *)((long)pvVar17 + uVar24 * 4),fVar28);
                *(float *)((long)pvVar15 + uVar24 * 4) = fVar27;
                uVar24 = uVar24 + 1;
              } while (uVar19 != uVar24);
            }
            uVar21 = uVar21 + 1;
            pvVar15 = (void *)((long)pvVar15 + lVar23);
            pvVar17 = (void *)((long)pvVar17 + lVar23);
          } while (uVar21 != uVar14);
          return 0;
        }
        return 0;
      }
      if (0 < (int)uVar16) {
        fVar28 = *pMVar7[1].data;
        pvVar17 = pMVar7->data;
        uVar21 = 0;
        do {
          fVar27 = powf(*(float *)((long)pvVar17 + uVar21 * 4),fVar28);
          *(float *)((long)pvVar15 + uVar21 * 4) = fVar27;
          uVar21 = uVar21 + 1;
        } while (uVar16 != uVar21);
        return 0;
      }
      return 0;
    }
    if (pMVar7[1].dims != 2) {
      return 0;
    }
    if (0 < (int)uVar16) {
      pvVar17 = pMVar7->data;
      pvVar22 = pMVar7[1].data;
      uVar21 = 0;
      do {
        fVar28 = powf(*(float *)((long)pvVar17 + uVar21 * 4),*(float *)((long)pvVar22 + uVar21 * 4))
        ;
        *(float *)((long)pvVar15 + uVar21 * 4) = fVar28;
        uVar21 = uVar21 + 1;
      } while (uVar16 != uVar21);
      return 0;
    }
    return 0;
  case 7:
    uVar1 = pMVar7->w;
    uVar19 = (ulong)uVar1;
    sVar8 = pMVar7->elemsize;
    uVar2 = pMVar7[1].w;
    uVar24 = (ulong)uVar2;
    uVar3 = pMVar7[1].h;
    uVar4 = pMVar7[1].c;
    uVar21 = (ulong)uVar4;
    iVar5 = pMVar7->dims;
    if (iVar5 == 1) {
      uVar14 = uVar3 * uVar2;
      iVar5 = pMVar7[1].dims;
      if (uVar1 == 1) {
        if (iVar5 == 1) {
          Mat::create(this_00,uVar2,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar2) {
              fVar28 = *pMVar7->data;
              pvVar17 = pMVar7[1].data;
              uVar21 = 0;
              do {
                *(float *)((long)pvVar15 + uVar21 * 4) =
                     *(float *)((long)pvVar17 + uVar21 * 4) - fVar28;
                uVar21 = uVar21 + 1;
              } while (uVar24 != uVar21);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 == 2) {
          Mat::create(this_00,uVar2,uVar3,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar14) {
              fVar28 = *pMVar7->data;
              pvVar17 = pMVar7[1].data;
              uVar21 = 0;
              do {
                *(float *)((long)pvVar15 + uVar21 * 4) =
                     *(float *)((long)pvVar17 + uVar21 * 4) - fVar28;
                uVar21 = uVar21 + 1;
              } while (uVar14 != uVar21);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if (0 < (int)uVar4) {
          fVar28 = *pMVar7->data;
          pvVar17 = pMVar7[1].data;
          sVar9 = pMVar7[1].elemsize;
          sVar10 = this_00->elemsize;
          sVar11 = pMVar7[1].cstep;
          uVar24 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar19 = 0;
              do {
                *(float *)((long)pvVar15 + uVar19 * 4) =
                     *(float *)((long)pvVar17 + uVar19 * 4) - fVar28;
                uVar19 = uVar19 + 1;
              } while (uVar14 != uVar19);
            }
            uVar24 = uVar24 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
            pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
          } while (uVar24 != uVar21);
          return 0;
        }
        return 0;
      }
      if (iVar5 != 1) {
        if (iVar5 == 2) {
          Mat::create(this_00,uVar2,uVar3,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (0 < (int)uVar3) {
              pvVar17 = pMVar7->data;
              pvVar22 = pMVar7[1].data;
              lVar23 = (long)(int)uVar2 * 4;
              uVar21 = 0;
              do {
                if (0 < (int)uVar2) {
                  fVar28 = *(float *)((long)pvVar17 + uVar21 * 4);
                  uVar19 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar19 * 4) =
                         *(float *)((long)pvVar22 + uVar19 * 4) - fVar28;
                    uVar19 = uVar19 + 1;
                  } while (uVar24 != uVar19);
                }
                uVar21 = uVar21 + 1;
                pvVar15 = (void *)((long)pvVar15 + lVar23);
                pvVar22 = (void *)((long)pvVar22 + lVar23);
              } while (uVar21 != uVar3);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        if (0 < (int)uVar4) {
          pvVar17 = pMVar7->data;
          pvVar22 = pMVar7[1].data;
          sVar9 = pMVar7[1].elemsize;
          sVar10 = this_00->elemsize;
          sVar11 = pMVar7[1].cstep;
          uVar24 = 0;
          do {
            if (0 < (int)uVar14) {
              fVar28 = *(float *)((long)pvVar17 + uVar24 * 4);
              uVar19 = 0;
              do {
                *(float *)((long)pvVar15 + uVar19 * 4) =
                     *(float *)((long)pvVar22 + uVar19 * 4) - fVar28;
                uVar19 = uVar19 + 1;
              } while (uVar14 != uVar19);
            }
            uVar24 = uVar24 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
            pvVar22 = (void *)((long)pvVar22 + sVar9 * sVar11);
          } while (uVar24 != uVar21);
          return 0;
        }
        return 0;
      }
      Mat::create(this_00,uVar1,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar7[1].w != 1) {
        if (0 < (int)uVar1) {
          pvVar17 = pMVar7->data;
          pvVar22 = pMVar7[1].data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar15 + uVar21 * 4) =
                 *(float *)((long)pvVar22 + uVar21 * 4) - *(float *)((long)pvVar17 + uVar21 * 4);
            uVar21 = uVar21 + 1;
          } while (uVar19 != uVar21);
          return 0;
        }
        return 0;
      }
      if (0 < (int)uVar1) {
        fVar28 = *pMVar7[1].data;
        pvVar17 = pMVar7->data;
        uVar21 = 0;
        do {
          *(float *)((long)pvVar15 + uVar21 * 4) = fVar28 - *(float *)((long)pvVar17 + uVar21 * 4);
          uVar21 = uVar21 + 1;
        } while (uVar19 != uVar21);
        return 0;
      }
      return 0;
    }
    uVar14 = pMVar7->h;
    uVar16 = uVar14 * uVar1;
    if (iVar5 != 2) {
      if (iVar5 != 3) {
        return 0;
      }
      uVar6 = pMVar7->c;
      uVar21 = (ulong)uVar6;
      Mat::create(this_00,uVar1,uVar14,uVar6,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      sVar8 = this_00->cstep;
      if ((long)this_00->c * sVar8 == 0) {
        return -100;
      }
      iVar5 = pMVar7[1].dims;
      if (iVar5 != 1) {
        if (iVar5 == 3) {
          if (((uVar2 == 1) && (uVar3 == 1)) && (uVar4 == uVar6)) {
            if (0 < (int)uVar6) {
              pvVar17 = pMVar7->data;
              sVar9 = pMVar7->elemsize;
              pvVar22 = pMVar7[1].data;
              sVar10 = pMVar7[1].elemsize;
              sVar11 = pMVar7[1].cstep;
              sVar12 = this_00->elemsize;
              sVar13 = pMVar7->cstep;
              uVar24 = 0;
              do {
                if (0 < (int)uVar16) {
                  uVar19 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar19 * 4) =
                         *(float *)((long)pvVar22 + sVar10 * sVar11 * uVar24) -
                         *(float *)((long)pvVar17 + uVar19 * 4);
                    uVar19 = uVar19 + 1;
                  } while (uVar16 != uVar19);
                }
                uVar24 = uVar24 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
                pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar13);
              } while (uVar24 != uVar21);
              return 0;
            }
            return 0;
          }
          if ((uVar2 == uVar1) && (uVar4 == 1 && uVar14 == uVar3)) {
            if (0 < (int)uVar6) {
              pvVar17 = pMVar7->data;
              sVar9 = pMVar7->elemsize;
              pvVar22 = pMVar7[1].data;
              sVar10 = this_00->elemsize;
              sVar11 = pMVar7->cstep;
              uVar24 = 0;
              do {
                if (0 < (int)uVar16) {
                  uVar19 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar19 * 4) =
                         *(float *)((long)pvVar22 + uVar19 * 4) -
                         *(float *)((long)pvVar17 + uVar19 * 4);
                    uVar19 = uVar19 + 1;
                  } while (uVar16 != uVar19);
                }
                uVar24 = uVar24 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
                pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
              } while (uVar24 != uVar21);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar6) {
            pvVar17 = pMVar7->data;
            sVar9 = pMVar7->elemsize;
            pvVar22 = pMVar7[1].data;
            sVar10 = pMVar7[1].elemsize;
            sVar11 = this_00->elemsize;
            sVar12 = pMVar7[1].cstep;
            sVar13 = pMVar7->cstep;
            uVar24 = 0;
            do {
              if (0 < (int)uVar16) {
                uVar19 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar19 * 4) =
                       *(float *)((long)pvVar22 + uVar19 * 4) -
                       *(float *)((long)pvVar17 + uVar19 * 4);
                  uVar19 = uVar19 + 1;
                } while (uVar16 != uVar19);
              }
              uVar24 = uVar24 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
              pvVar22 = (void *)((long)pvVar22 + sVar10 * sVar12);
              pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar13);
            } while (uVar24 != uVar21);
            return 0;
          }
          return 0;
        }
        if (iVar5 != 2) {
          return 0;
        }
        if (0 < (int)uVar6) {
          pvVar17 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          iVar5 = pMVar7[1].w;
          sVar10 = pMVar7[1].elemsize;
          pvVar22 = pMVar7[1].data;
          sVar11 = this_00->elemsize;
          lVar23 = (long)(int)uVar1 * 4;
          sVar12 = pMVar7->cstep;
          uVar24 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar26 = 0;
              pvVar18 = pvVar17;
              pvVar25 = pvVar15;
              do {
                if (0 < (int)uVar1) {
                  fVar28 = *(float *)((long)pvVar22 + uVar26 * 4 + (long)iVar5 * sVar10 * uVar24);
                  uVar20 = 0;
                  do {
                    *(float *)((long)pvVar25 + uVar20 * 4) =
                         fVar28 - *(float *)((long)pvVar18 + uVar20 * 4);
                    uVar20 = uVar20 + 1;
                  } while (uVar19 != uVar20);
                }
                uVar26 = uVar26 + 1;
                pvVar25 = (void *)((long)pvVar25 + lVar23);
                pvVar18 = (void *)((long)pvVar18 + lVar23);
              } while (uVar26 != uVar14);
            }
            uVar24 = uVar24 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
            pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar12);
          } while (uVar24 != uVar21);
          return 0;
        }
        return 0;
      }
      if (pMVar7[1].w != 1) {
        if (0 < (int)uVar6) {
          pvVar17 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          pvVar22 = pMVar7[1].data;
          sVar10 = this_00->elemsize;
          sVar11 = pMVar7->cstep;
          uVar24 = 0;
          do {
            if (0 < (int)uVar16) {
              fVar28 = *(float *)((long)pvVar22 + uVar24 * 4);
              uVar19 = 0;
              do {
                *(float *)((long)pvVar15 + uVar19 * 4) =
                     fVar28 - *(float *)((long)pvVar17 + uVar19 * 4);
                uVar19 = uVar19 + 1;
              } while (uVar16 != uVar19);
            }
            uVar24 = uVar24 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
            pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
          } while (uVar24 != uVar21);
          return 0;
        }
        return 0;
      }
      if (0 < (int)uVar6) {
        fVar28 = *pMVar7[1].data;
        pvVar17 = pMVar7->data;
        sVar9 = pMVar7->elemsize;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar7->cstep;
        uVar24 = 0;
        do {
          if (0 < (int)uVar16) {
            uVar19 = 0;
            do {
              *(float *)((long)pvVar15 + uVar19 * 4) =
                   fVar28 - *(float *)((long)pvVar17 + uVar19 * 4);
              uVar19 = uVar19 + 1;
            } while (uVar16 != uVar19);
          }
          uVar24 = uVar24 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
          pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
        } while (uVar24 != uVar21);
        return 0;
      }
      return 0;
    }
    if (pMVar7[1].dims == 3) {
      Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      sVar8 = this_00->cstep;
      if ((long)this_00->c * sVar8 != 0) {
        if (0 < (int)uVar4) {
          pvVar17 = pMVar7->data;
          pvVar22 = pMVar7[1].data;
          iVar5 = pMVar7->w;
          sVar9 = pMVar7->elemsize;
          sVar10 = pMVar7[1].elemsize;
          sVar11 = this_00->elemsize;
          lVar23 = (long)(int)uVar2 * 4;
          sVar12 = pMVar7[1].cstep;
          uVar19 = 0;
          do {
            if (0 < (int)uVar3) {
              uVar26 = 0;
              pvVar18 = pvVar15;
              pvVar25 = pvVar22;
              do {
                if (0 < (int)uVar2) {
                  fVar28 = *(float *)((long)pvVar17 + uVar26 * 4 + (long)iVar5 * sVar9 * uVar19);
                  uVar20 = 0;
                  do {
                    *(float *)((long)pvVar18 + uVar20 * 4) =
                         *(float *)((long)pvVar25 + uVar20 * 4) - fVar28;
                    uVar20 = uVar20 + 1;
                  } while (uVar24 != uVar20);
                }
                uVar26 = uVar26 + 1;
                pvVar18 = (void *)((long)pvVar18 + lVar23);
                pvVar25 = (void *)((long)pvVar25 + lVar23);
              } while (uVar26 != uVar3);
            }
            uVar19 = uVar19 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
            pvVar22 = (void *)((long)pvVar22 + sVar10 * sVar12);
          } while (uVar19 != uVar21);
          return 0;
        }
        return 0;
      }
      return -100;
    }
    Mat::create(this_00,uVar1,uVar14,sVar8,opt->blob_allocator);
    pvVar15 = this_00->data;
    if (pvVar15 == (void *)0x0) {
      return -100;
    }
    if ((long)this_00->c * this_00->cstep == 0) {
      return -100;
    }
    if (pMVar7[1].dims == 1) {
      Mat::create(this_00,uVar1,uVar14,sVar8,opt->blob_allocator);
      pvVar15 = this_00->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (pMVar7[1].w != 1) {
        if (0 < (int)uVar14) {
          pvVar17 = pMVar7->data;
          pvVar22 = pMVar7[1].data;
          lVar23 = (long)(int)uVar1 * 4;
          uVar21 = 0;
          do {
            if (0 < (int)uVar1) {
              fVar28 = *(float *)((long)pvVar22 + uVar21 * 4);
              uVar24 = 0;
              do {
                *(float *)((long)pvVar15 + uVar24 * 4) =
                     fVar28 - *(float *)((long)pvVar17 + uVar24 * 4);
                uVar24 = uVar24 + 1;
              } while (uVar19 != uVar24);
            }
            uVar21 = uVar21 + 1;
            pvVar15 = (void *)((long)pvVar15 + lVar23);
            pvVar17 = (void *)((long)pvVar17 + lVar23);
          } while (uVar21 != uVar14);
          return 0;
        }
        return 0;
      }
      if (0 < (int)uVar16) {
        fVar28 = *pMVar7[1].data;
        pvVar17 = pMVar7->data;
        uVar21 = 0;
        do {
          *(float *)((long)pvVar15 + uVar21 * 4) = fVar28 - *(float *)((long)pvVar17 + uVar21 * 4);
          uVar21 = uVar21 + 1;
        } while (uVar16 != uVar21);
        return 0;
      }
      return 0;
    }
    if (pMVar7[1].dims != 2) {
      return 0;
    }
    if (0 < (int)uVar16) {
      pvVar17 = pMVar7->data;
      pvVar22 = pMVar7[1].data;
      uVar21 = 0;
      do {
        *(float *)((long)pvVar15 + uVar21 * 4) =
             *(float *)((long)pvVar22 + uVar21 * 4) - *(float *)((long)pvVar17 + uVar21 * 4);
        uVar21 = uVar21 + 1;
      } while (uVar16 != uVar21);
      return 0;
    }
    return 0;
  case 8:
    uVar1 = pMVar7->w;
    uVar19 = (ulong)uVar1;
    sVar8 = pMVar7->elemsize;
    uVar2 = pMVar7[1].w;
    uVar24 = (ulong)uVar2;
    uVar3 = pMVar7[1].h;
    uVar4 = pMVar7[1].c;
    uVar21 = (ulong)uVar4;
    iVar5 = pMVar7->dims;
    if (iVar5 == 1) {
      uVar14 = uVar3 * uVar2;
      iVar5 = pMVar7[1].dims;
      if (uVar1 == 1) {
        if (iVar5 != 1) {
          if (iVar5 == 2) {
            Mat::create(this_00,uVar2,uVar3,sVar8,opt->blob_allocator);
            pvVar15 = this_00->data;
            if (pvVar15 == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if (0 < (int)uVar14) {
                pvVar17 = pMVar7[1].data;
                fVar28 = *pMVar7->data;
                uVar21 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar21 * 4) =
                       *(float *)((long)pvVar17 + uVar21 * 4) * (1.0 / fVar28);
                  uVar21 = uVar21 + 1;
                } while (uVar14 != uVar21);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 != 3) {
            return 0;
          }
          Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if (0 < (int)uVar4) {
            pvVar17 = pMVar7[1].data;
            sVar9 = this_00->elemsize;
            sVar10 = pMVar7[1].elemsize;
            fVar28 = *pMVar7->data;
            sVar11 = pMVar7[1].cstep;
            uVar24 = 0;
            do {
              if (0 < (int)uVar14) {
                uVar19 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar19 * 4) =
                       *(float *)((long)pvVar17 + uVar19 * 4) * (1.0 / fVar28);
                  uVar19 = uVar19 + 1;
                } while (uVar14 != uVar19);
              }
              uVar24 = uVar24 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar9);
              pvVar17 = (void *)((long)pvVar17 + sVar10 * sVar11);
            } while (uVar24 != uVar21);
            return 0;
          }
          return 0;
        }
        Mat::create(this_00,uVar2,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 != (void *)0x0) {
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)uVar2) {
            pvVar17 = pMVar7[1].data;
            fVar28 = *pMVar7->data;
            uVar21 = 0;
            do {
              *(float *)((long)pvVar15 + uVar21 * 4) =
                   *(float *)((long)pvVar17 + uVar21 * 4) * (1.0 / fVar28);
              uVar21 = uVar21 + 1;
            } while (uVar24 != uVar21);
            return 0;
          }
          return 0;
        }
      }
      else if (iVar5 == 1) {
        Mat::create(this_00,uVar1,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 != (void *)0x0) {
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (pMVar7[1].w == 1) {
            if (0 < (int)uVar1) {
              fVar28 = *pMVar7[1].data;
              pvVar17 = pMVar7->data;
              uVar21 = 0;
              do {
                *(float *)((long)pvVar15 + uVar21 * 4) =
                     fVar28 / *(float *)((long)pvVar17 + uVar21 * 4);
                uVar21 = uVar21 + 1;
              } while (uVar19 != uVar21);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar1) {
            pvVar17 = pMVar7->data;
            pvVar22 = pMVar7[1].data;
            uVar21 = 0;
            do {
              *(float *)((long)pvVar15 + uVar21 * 4) =
                   *(float *)((long)pvVar22 + uVar21 * 4) / *(float *)((long)pvVar17 + uVar21 * 4);
              uVar21 = uVar21 + 1;
            } while (uVar19 != uVar21);
            return 0;
          }
          return 0;
        }
      }
      else if (iVar5 == 2) {
        Mat::create(this_00,uVar2,uVar3,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 != (void *)0x0) {
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (0 < (int)uVar3) {
            pvVar17 = pMVar7->data;
            pvVar22 = pMVar7[1].data;
            lVar23 = (long)(int)uVar2 * 4;
            uVar21 = 0;
            do {
              if (0 < (int)uVar2) {
                fVar28 = *(float *)((long)pvVar17 + uVar21 * 4);
                uVar19 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar19 * 4) =
                       *(float *)((long)pvVar22 + uVar19 * 4) * (1.0 / fVar28);
                  uVar19 = uVar19 + 1;
                } while (uVar24 != uVar19);
              }
              uVar21 = uVar21 + 1;
              pvVar15 = (void *)((long)pvVar15 + lVar23);
              pvVar22 = (void *)((long)pvVar22 + lVar23);
            } while (uVar21 != uVar3);
            return 0;
          }
          return 0;
        }
      }
      else {
        if (iVar5 != 3) {
          return 0;
        }
        Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 != (void *)0x0) {
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if (0 < (int)uVar4) {
            pvVar17 = pMVar7->data;
            pvVar22 = pMVar7[1].data;
            sVar9 = pMVar7[1].elemsize;
            sVar10 = this_00->elemsize;
            sVar11 = pMVar7[1].cstep;
            uVar24 = 0;
            do {
              if (0 < (int)uVar14) {
                fVar28 = *(float *)((long)pvVar17 + uVar24 * 4);
                uVar19 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar19 * 4) =
                       *(float *)((long)pvVar22 + uVar19 * 4) * (1.0 / fVar28);
                  uVar19 = uVar19 + 1;
                } while (uVar14 != uVar19);
              }
              uVar24 = uVar24 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
              pvVar22 = (void *)((long)pvVar22 + sVar9 * sVar11);
            } while (uVar24 != uVar21);
            return 0;
          }
          return 0;
        }
      }
    }
    else {
      uVar14 = pMVar7->h;
      uVar16 = uVar14 * uVar1;
      if (iVar5 != 2) {
        if (iVar5 != 3) {
          return 0;
        }
        uVar6 = pMVar7->c;
        uVar21 = (ulong)uVar6;
        Mat::create(this_00,uVar1,uVar14,uVar6,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 == (void *)0x0) {
          return -100;
        }
        sVar8 = this_00->cstep;
        if ((long)this_00->c * sVar8 == 0) {
          return -100;
        }
        iVar5 = pMVar7[1].dims;
        if (iVar5 != 1) {
          if (iVar5 == 3) {
            if (((uVar2 == 1) && (uVar3 == 1)) && (uVar4 == uVar6)) {
              if (0 < (int)uVar6) {
                pvVar17 = pMVar7->data;
                sVar9 = pMVar7->elemsize;
                pvVar22 = pMVar7[1].data;
                sVar10 = pMVar7[1].elemsize;
                sVar11 = pMVar7[1].cstep;
                sVar12 = this_00->elemsize;
                sVar13 = pMVar7->cstep;
                uVar24 = 0;
                do {
                  if (0 < (int)uVar16) {
                    uVar19 = 0;
                    do {
                      *(float *)((long)pvVar15 + uVar19 * 4) =
                           *(float *)((long)pvVar22 + sVar10 * sVar11 * uVar24) /
                           *(float *)((long)pvVar17 + uVar19 * 4);
                      uVar19 = uVar19 + 1;
                    } while (uVar16 != uVar19);
                  }
                  uVar24 = uVar24 + 1;
                  pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar12);
                  pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar13);
                } while (uVar24 != uVar21);
                return 0;
              }
              return 0;
            }
            if ((uVar2 == uVar1) && (uVar4 == 1 && uVar14 == uVar3)) {
              if (0 < (int)uVar6) {
                pvVar17 = pMVar7->data;
                sVar9 = pMVar7->elemsize;
                pvVar22 = pMVar7[1].data;
                sVar10 = this_00->elemsize;
                sVar11 = pMVar7->cstep;
                uVar24 = 0;
                do {
                  if (0 < (int)uVar16) {
                    uVar19 = 0;
                    do {
                      *(float *)((long)pvVar15 + uVar19 * 4) =
                           *(float *)((long)pvVar22 + uVar19 * 4) /
                           *(float *)((long)pvVar17 + uVar19 * 4);
                      uVar19 = uVar19 + 1;
                    } while (uVar16 != uVar19);
                  }
                  uVar24 = uVar24 + 1;
                  pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
                  pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
                } while (uVar24 != uVar21);
                return 0;
              }
              return 0;
            }
            if (0 < (int)uVar6) {
              pvVar17 = pMVar7->data;
              sVar9 = pMVar7->elemsize;
              pvVar22 = pMVar7[1].data;
              sVar10 = pMVar7[1].elemsize;
              sVar11 = this_00->elemsize;
              sVar12 = pMVar7[1].cstep;
              sVar13 = pMVar7->cstep;
              uVar24 = 0;
              do {
                if (0 < (int)uVar16) {
                  uVar19 = 0;
                  do {
                    *(float *)((long)pvVar15 + uVar19 * 4) =
                         *(float *)((long)pvVar22 + uVar19 * 4) /
                         *(float *)((long)pvVar17 + uVar19 * 4);
                    uVar19 = uVar19 + 1;
                  } while (uVar16 != uVar19);
                }
                uVar24 = uVar24 + 1;
                pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
                pvVar22 = (void *)((long)pvVar22 + sVar10 * sVar12);
                pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar13);
              } while (uVar24 != uVar21);
              return 0;
            }
            return 0;
          }
          if (iVar5 != 2) {
            return 0;
          }
          if (0 < (int)uVar6) {
            pvVar17 = pMVar7->data;
            sVar9 = pMVar7->elemsize;
            iVar5 = pMVar7[1].w;
            sVar10 = pMVar7[1].elemsize;
            pvVar22 = pMVar7[1].data;
            sVar11 = this_00->elemsize;
            lVar23 = (long)(int)uVar1 * 4;
            sVar12 = pMVar7->cstep;
            uVar24 = 0;
            do {
              if (0 < (int)uVar14) {
                uVar26 = 0;
                pvVar18 = pvVar17;
                pvVar25 = pvVar15;
                do {
                  if (0 < (int)uVar1) {
                    fVar28 = *(float *)((long)pvVar22 + uVar26 * 4 + (long)iVar5 * sVar10 * uVar24);
                    uVar20 = 0;
                    do {
                      *(float *)((long)pvVar25 + uVar20 * 4) =
                           fVar28 / *(float *)((long)pvVar18 + uVar20 * 4);
                      uVar20 = uVar20 + 1;
                    } while (uVar19 != uVar20);
                  }
                  uVar26 = uVar26 + 1;
                  pvVar25 = (void *)((long)pvVar25 + lVar23);
                  pvVar18 = (void *)((long)pvVar18 + lVar23);
                } while (uVar26 != uVar14);
              }
              uVar24 = uVar24 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
              pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar12);
            } while (uVar24 != uVar21);
            return 0;
          }
          return 0;
        }
        if (pMVar7[1].w != 1) {
          if (0 < (int)uVar6) {
            pvVar17 = pMVar7->data;
            sVar9 = pMVar7->elemsize;
            pvVar22 = pMVar7[1].data;
            sVar10 = this_00->elemsize;
            sVar11 = pMVar7->cstep;
            uVar24 = 0;
            do {
              if (0 < (int)uVar16) {
                fVar28 = *(float *)((long)pvVar22 + uVar24 * 4);
                uVar19 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar19 * 4) =
                       fVar28 / *(float *)((long)pvVar17 + uVar19 * 4);
                  uVar19 = uVar19 + 1;
                } while (uVar16 != uVar19);
              }
              uVar24 = uVar24 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
              pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
            } while (uVar24 != uVar21);
            return 0;
          }
          return 0;
        }
        if (0 < (int)uVar6) {
          fVar28 = *pMVar7[1].data;
          pvVar17 = pMVar7->data;
          sVar9 = pMVar7->elemsize;
          sVar10 = this_00->elemsize;
          sVar11 = pMVar7->cstep;
          uVar24 = 0;
          do {
            if (0 < (int)uVar16) {
              uVar19 = 0;
              do {
                *(float *)((long)pvVar15 + uVar19 * 4) =
                     fVar28 / *(float *)((long)pvVar17 + uVar19 * 4);
                uVar19 = uVar19 + 1;
              } while (uVar16 != uVar19);
            }
            uVar24 = uVar24 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
            pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar11);
          } while (uVar24 != uVar21);
          return 0;
        }
        return 0;
      }
      if (pMVar7[1].dims == 3) {
        Mat::create(this_00,uVar2,uVar3,uVar4,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if (pvVar15 != (void *)0x0) {
          sVar8 = this_00->cstep;
          if ((long)this_00->c * sVar8 == 0) {
            return -100;
          }
          if (0 < (int)uVar4) {
            pvVar17 = pMVar7->data;
            pvVar22 = pMVar7[1].data;
            iVar5 = pMVar7->w;
            sVar9 = pMVar7[1].elemsize;
            sVar10 = pMVar7->elemsize;
            sVar11 = this_00->elemsize;
            lVar23 = (long)(int)uVar2 * 4;
            sVar12 = pMVar7[1].cstep;
            uVar19 = 0;
            do {
              if (0 < (int)uVar3) {
                uVar26 = 0;
                pvVar18 = pvVar15;
                pvVar25 = pvVar22;
                do {
                  if (0 < (int)uVar2) {
                    fVar28 = *(float *)((long)pvVar17 + uVar26 * 4 + (long)iVar5 * sVar10 * uVar19);
                    uVar20 = 0;
                    do {
                      *(float *)((long)pvVar18 + uVar20 * 4) =
                           *(float *)((long)pvVar25 + uVar20 * 4) * (1.0 / fVar28);
                      uVar20 = uVar20 + 1;
                    } while (uVar24 != uVar20);
                  }
                  uVar26 = uVar26 + 1;
                  pvVar18 = (void *)((long)pvVar18 + lVar23);
                  pvVar25 = (void *)((long)pvVar25 + lVar23);
                } while (uVar26 != uVar3);
              }
              uVar19 = uVar19 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
              pvVar22 = (void *)((long)pvVar22 + sVar9 * sVar12);
            } while (uVar19 != uVar21);
            return 0;
          }
          return 0;
        }
      }
      else {
        Mat::create(this_00,uVar1,uVar14,sVar8,opt->blob_allocator);
        pvVar15 = this_00->data;
        if ((pvVar15 != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
          if (pMVar7[1].dims != 1) {
            if (pMVar7[1].dims != 2) {
              return 0;
            }
            if (0 < (int)uVar16) {
              pvVar17 = pMVar7->data;
              pvVar22 = pMVar7[1].data;
              uVar21 = 0;
              do {
                *(float *)((long)pvVar15 + uVar21 * 4) =
                     *(float *)((long)pvVar22 + uVar21 * 4) / *(float *)((long)pvVar17 + uVar21 * 4)
                ;
                uVar21 = uVar21 + 1;
              } while (uVar16 != uVar21);
              return 0;
            }
            return 0;
          }
          Mat::create(this_00,uVar1,uVar14,sVar8,opt->blob_allocator);
          pvVar15 = this_00->data;
          if (pvVar15 == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if (pMVar7[1].w != 1) {
              if (0 < (int)uVar14) {
                pvVar17 = pMVar7->data;
                pvVar22 = pMVar7[1].data;
                lVar23 = (long)(int)uVar1 * 4;
                uVar21 = 0;
                do {
                  if (0 < (int)uVar1) {
                    fVar28 = *(float *)((long)pvVar22 + uVar21 * 4);
                    uVar24 = 0;
                    do {
                      *(float *)((long)pvVar15 + uVar24 * 4) =
                           fVar28 / *(float *)((long)pvVar17 + uVar24 * 4);
                      uVar24 = uVar24 + 1;
                    } while (uVar19 != uVar24);
                  }
                  uVar21 = uVar21 + 1;
                  pvVar15 = (void *)((long)pvVar15 + lVar23);
                  pvVar17 = (void *)((long)pvVar17 + lVar23);
                } while (uVar21 != uVar14);
                return 0;
              }
              return 0;
            }
            if (0 < (int)uVar16) {
              fVar28 = *pMVar7[1].data;
              pvVar17 = pMVar7->data;
              uVar21 = 0;
              do {
                *(float *)((long)pvVar15 + uVar21 * 4) =
                     fVar28 / *(float *)((long)pvVar17 + uVar21 * 4);
                uVar21 = uVar21 + 1;
              } while (uVar16 != uVar21);
              return 0;
            }
            return 0;
          }
          return -100;
        }
      }
    }
    return -100;
  }
  return 0;
}

Assistant:

int BinaryOp::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& bottom_blob1 = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];

    if (op_type == Operation_ADD)
        return binary_op< std::plus<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_SUB)
        return binary_op< std::minus<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MUL)
        return binary_op< std::multiplies<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_DIV)
        return binary_op< std::divides<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MAX)
        return binary_op< binary_op_max<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MIN)
        return binary_op< binary_op_min<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_POW)
        return binary_op< binary_op_pow<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_RSUB)
        return binary_op< binary_op_rsub<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_RDIV)
        return binary_op< binary_op_rdiv<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    return 0;
}